

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layernorm_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::LayerNorm_x86_avx512::forward_inplace
          (LayerNorm_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  undefined1 (*pauVar4) [64];
  undefined1 (*pauVar5) [64];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined1 (*pauVar25) [64];
  uint *puVar26;
  ulong uVar27;
  int iVar28;
  undefined1 (*pauVar29) [64];
  uint *puVar30;
  long lVar31;
  int iVar32;
  undefined1 (*pauVar33) [64];
  ulong uVar34;
  int q;
  int iVar35;
  int iVar36;
  undefined1 (*pauVar37) [64];
  uint *puVar38;
  int i;
  ulong uVar39;
  undefined1 (*pauVar40) [64];
  ulong uVar41;
  undefined1 (*pauVar42) [64];
  undefined1 auVar52 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar50 [32];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar91 [48];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar69 [64];
  undefined1 auVar51 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar80 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar86 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  float fVar92;
  float _mean;
  undefined1 auVar93 [64];
  float fVar94;
  float fVar120;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  float fVar121;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar125;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined4 uVar140;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [64];
  undefined1 in_ZMM16 [64];
  undefined1 auVar147 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 auVar59 [64];
  undefined1 auVar74 [64];
  undefined1 auVar65 [64];
  undefined1 auVar68 [64];
  undefined1 auVar79 [64];
  undefined1 auVar81 [64];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  
  auVar93 = _DAT_004d0240;
  iVar32 = bottom_top_blob->elempack;
  iVar35 = bottom_top_blob->dims;
  iVar28 = bottom_top_blob->w;
  pp_Var2 = this->_vptr_LayerNorm_x86_avx512;
  p_Var3 = pp_Var2[-3];
  pauVar4 = *(undefined1 (**) [64])(&this->field_0xe0 + (long)p_Var3);
  pauVar5 = *(undefined1 (**) [64])(&this->field_0x128 + (long)p_Var3);
  if (iVar35 == 1) {
    iVar28 = iVar28 * iVar32;
    pauVar25 = (undefined1 (*) [64])bottom_top_blob->data;
    auVar93 = ZEXT1664(ZEXT816(0) << 0x40);
    pauVar42 = pauVar25;
    iVar32 = 0;
    while (iVar32 + 0x10 <= iVar28) {
      auVar93 = vaddps_avx512f(auVar93,*pauVar42);
      pauVar42 = pauVar42 + 1;
      iVar32 = iVar32 + 0x10;
    }
    fVar92 = 0.0;
    fVar121 = 0.0;
    fVar94 = 0.0;
    fVar120 = 0.0;
    fVar122 = 0.0;
    fVar123 = 0.0;
    fVar124 = 0.0;
    fVar125 = 0.0;
    while (iVar32 + 8 <= iVar28) {
      fVar94 = fVar94 + *(float *)*pauVar42;
      fVar120 = fVar120 + *(float *)(*pauVar42 + 4);
      fVar92 = fVar92 + *(float *)(*pauVar42 + 8);
      fVar121 = fVar121 + *(float *)(*pauVar42 + 0xc);
      fVar122 = fVar122 + *(float *)(*pauVar42 + 0x10);
      fVar123 = fVar123 + *(float *)(*pauVar42 + 0x14);
      fVar124 = fVar124 + *(float *)(*pauVar42 + 0x18);
      fVar125 = fVar125 + *(float *)(*pauVar42 + 0x1c);
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
      iVar32 = iVar32 + 8;
    }
    auVar43 = ZEXT816(0) << 0x40;
    while (iVar32 + 4 <= iVar28) {
      auVar44._0_4_ = auVar43._0_4_ + *(float *)*pauVar42;
      auVar44._4_4_ = auVar43._4_4_ + *(float *)(*pauVar42 + 4);
      auVar44._8_4_ = auVar43._8_4_ + *(float *)(*pauVar42 + 8);
      auVar44._12_4_ = auVar43._12_4_ + *(float *)(*pauVar42 + 0xc);
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
      iVar32 = iVar32 + 4;
      auVar43 = auVar44;
    }
    fVar131 = 0.0;
    for (; iVar32 < iVar28; iVar32 = iVar32 + 1) {
      fVar131 = fVar131 + *(float *)*pauVar42;
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
    }
    auVar48 = vextractf64x4_avx512f(auVar93,1);
    auVar93 = vaddps_avx512f(auVar93,ZEXT3264(auVar48));
    auVar45._0_4_ = auVar93._0_4_ + auVar93._16_4_;
    auVar45._4_4_ = auVar93._4_4_ + auVar93._20_4_;
    auVar45._8_4_ = auVar93._8_4_ + auVar93._24_4_;
    auVar45._12_4_ = auVar93._12_4_ + auVar93._28_4_;
    auVar44 = vshufpd_avx(auVar45,auVar45,1);
    auVar47._0_4_ = auVar45._0_4_ + auVar44._0_4_;
    auVar47._4_4_ = auVar45._4_4_ + auVar44._4_4_;
    auVar47._8_4_ = auVar45._8_4_ + auVar44._8_4_;
    auVar47._12_4_ = auVar45._12_4_ + auVar44._12_4_;
    auVar44 = vhaddps_avx(auVar47,auVar47);
    auVar46._0_4_ = fVar122 + fVar94;
    auVar46._4_4_ = fVar123 + fVar120;
    auVar46._8_4_ = fVar124 + fVar92;
    auVar46._12_4_ = fVar125 + fVar121;
    auVar45 = vshufps_avx(auVar43,auVar46,0x41);
    auVar43 = vshufps_avx(auVar43,auVar46,0xeb);
    auVar105._0_4_ = auVar43._0_4_ + auVar45._0_4_;
    auVar105._4_4_ = auVar43._4_4_ + auVar45._4_4_;
    auVar105._8_4_ = auVar43._8_4_ + auVar45._8_4_;
    auVar105._12_4_ = auVar43._12_4_ + auVar45._12_4_;
    auVar43 = vshufpd_avx(auVar105,auVar105,1);
    auVar106._0_4_ = auVar105._0_4_ + auVar43._0_4_;
    auVar106._4_4_ = auVar105._4_4_ + auVar43._4_4_;
    auVar106._8_4_ = auVar105._8_4_ + auVar43._8_4_;
    auVar106._12_4_ = auVar105._12_4_ + auVar43._12_4_;
    auVar43 = vhaddps_avx(auVar106,auVar106);
    auVar43._0_4_ = (fVar131 + auVar44._0_4_ + auVar43._0_4_) / (float)iVar28;
    auVar43._4_12_ = SUB6012((undefined1  [60])0x0,0);
    auVar93 = vbroadcastss_avx512f(auVar43);
    auVar53 = ZEXT864(0) << 0x20;
    pauVar42 = pauVar25;
    iVar32 = 0;
    while (iVar32 + 0x10 <= iVar28) {
      auVar54 = vsubps_avx512f(*pauVar42,auVar93);
      auVar53 = vfmadd231ps_avx512f(auVar53,auVar54,auVar54);
      pauVar42 = pauVar42 + 1;
      iVar32 = iVar32 + 0x10;
    }
    uVar140 = auVar93._0_4_;
    auVar48._4_4_ = uVar140;
    auVar48._0_4_ = uVar140;
    auVar48._8_4_ = uVar140;
    auVar48._12_4_ = uVar140;
    auVar48._16_4_ = uVar140;
    auVar48._20_4_ = uVar140;
    auVar48._24_4_ = uVar140;
    auVar48._28_4_ = uVar140;
    auVar44 = ZEXT816(0) << 0x40;
    while (iVar32 + 8 <= iVar28) {
      auVar49 = vsubps_avx(*(undefined1 (*) [32])*pauVar42,auVar48);
      auVar44 = vfmadd231ps_fma(ZEXT1632(auVar44),auVar49,auVar49);
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
      iVar32 = iVar32 + 8;
    }
    auVar45 = ZEXT416(0) << 0x20;
    while( true ) {
      if (iVar28 < iVar32 + 4) break;
      auVar47 = vsubps_avx(*(undefined1 (*) [16])*pauVar42,auVar93._0_16_);
      auVar45 = vfmadd231ps_fma(auVar45,auVar47,auVar47);
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
      iVar32 = iVar32 + 4;
    }
    auVar47 = ZEXT816(0) << 0x40;
    for (; iVar32 < iVar28; iVar32 = iVar32 + 1) {
      auVar46 = ZEXT416((uint)(*(float *)*pauVar42 - auVar43._0_4_));
      auVar47 = vfmadd231ss_fma(auVar47,auVar46,auVar46);
      pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
    }
    auVar48 = vextractf64x4_avx512f(auVar53,1);
    auVar93 = vaddps_avx512f(auVar53,ZEXT3264(auVar48));
    auVar128._0_4_ = auVar93._0_4_ + auVar93._16_4_;
    auVar128._4_4_ = auVar93._4_4_ + auVar93._20_4_;
    auVar128._8_4_ = auVar93._8_4_ + auVar93._24_4_;
    auVar128._12_4_ = auVar93._12_4_ + auVar93._28_4_;
    auVar46 = vshufpd_avx(auVar128,auVar128,1);
    auVar129._0_4_ = auVar128._0_4_ + auVar46._0_4_;
    auVar129._4_4_ = auVar128._4_4_ + auVar46._4_4_;
    auVar129._8_4_ = auVar128._8_4_ + auVar46._8_4_;
    auVar129._12_4_ = auVar128._12_4_ + auVar46._12_4_;
    auVar46 = vhaddps_avx(auVar129,auVar129);
    auVar134._0_4_ = auVar44._0_4_ + 0.0;
    auVar134._4_4_ = auVar44._4_4_ + 0.0;
    auVar134._8_4_ = auVar44._8_4_ + 0.0;
    auVar134._12_4_ = auVar44._12_4_ + 0.0;
    auVar44 = vshufps_avx(auVar45,auVar134,0x41);
    auVar45 = vshufps_avx(auVar45,auVar134,0xeb);
    auVar135._0_4_ = auVar45._0_4_ + auVar44._0_4_;
    auVar135._4_4_ = auVar45._4_4_ + auVar44._4_4_;
    auVar135._8_4_ = auVar45._8_4_ + auVar44._8_4_;
    auVar135._12_4_ = auVar45._12_4_ + auVar44._12_4_;
    auVar44 = vshufpd_avx(auVar135,auVar135,1);
    auVar136._0_4_ = auVar135._0_4_ + auVar44._0_4_;
    auVar136._4_4_ = auVar135._4_4_ + auVar44._4_4_;
    auVar136._8_4_ = auVar135._8_4_ + auVar44._8_4_;
    auVar136._12_4_ = auVar135._12_4_ + auVar44._12_4_;
    auVar44 = vhaddps_avx(auVar136,auVar136);
    fVar92 = (auVar47._0_4_ + auVar46._0_4_ + auVar44._0_4_) / (float)iVar28 +
             *(float *)(&this->field_0xd4 + (long)p_Var3);
    auVar44 = vrsqrtss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar92));
    auVar45 = vfmadd213ss_fma(ZEXT416((uint)(fVar92 * auVar44._0_4_)),auVar44,ZEXT416(0xc0400000));
    fVar92 = auVar44._0_4_ * -0.5 * auVar45._0_4_;
    auVar9._8_4_ = 0x80000000;
    auVar9._0_8_ = 0x8000000080000000;
    auVar9._12_4_ = 0x80000000;
    auVar43 = vxorps_avx512vl(auVar43,auVar9);
    fVar121 = fVar92 * auVar43._0_4_;
    auVar43 = ZEXT416((uint)fVar92);
    auVar93 = vbroadcastss_avx512f(auVar43);
    auVar53 = vbroadcastss_avx512f(ZEXT416((uint)fVar121));
    uVar140 = auVar93._0_4_;
    auVar107._0_4_ = auVar53._0_4_;
    if (*(int *)(&this->field_0xd8 + (long)p_Var3) == 0) {
      iVar32 = 0;
      while (iVar32 + 0x10 <= iVar28) {
        auVar54 = vfmadd132ps_avx512f(*pauVar25,auVar53,auVar93);
        *pauVar25 = auVar54;
        pauVar25 = pauVar25 + 1;
        iVar32 = iVar32 + 0x10;
      }
      auVar139._4_4_ = uVar140;
      auVar139._0_4_ = uVar140;
      auVar139._8_4_ = uVar140;
      auVar139._12_4_ = uVar140;
      auVar49._4_4_ = auVar107._0_4_;
      auVar49._0_4_ = auVar107._0_4_;
      auVar49._8_4_ = auVar107._0_4_;
      auVar49._12_4_ = auVar107._0_4_;
      auVar49._16_4_ = auVar107._0_4_;
      auVar49._20_4_ = auVar107._0_4_;
      auVar49._24_4_ = auVar107._0_4_;
      auVar49._28_4_ = auVar107._0_4_;
      while (iVar32 + 8 <= iVar28) {
        auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])*pauVar25,auVar49,auVar93._0_32_);
        *(undefined1 (*) [32])*pauVar25 = ZEXT1632(auVar44);
        pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
        iVar32 = iVar32 + 8;
      }
      auVar113._4_4_ = auVar107._0_4_;
      auVar113._0_4_ = auVar107._0_4_;
      auVar113._8_4_ = auVar107._0_4_;
      auVar113._12_4_ = auVar107._0_4_;
      while (iVar32 + 4 <= iVar28) {
        auVar44 = vfmadd132ps_fma(*(undefined1 (*) [16])*pauVar25,auVar113,auVar139);
        *(undefined1 (*) [16])*pauVar25 = auVar44;
        pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
        iVar32 = iVar32 + 4;
      }
      for (; iVar32 < iVar28; iVar32 = iVar32 + 1) {
        auVar44 = vfmadd132ss_fma(ZEXT416(*(uint *)*pauVar25),ZEXT416((uint)fVar121),auVar43);
        *(int *)*pauVar25 = auVar44._0_4_;
        pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
      }
    }
    else {
      for (uVar27 = 0; (int)uVar27 + 0x10 <= iVar28; uVar27 = uVar27 + 0x10) {
        auVar54 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(*pauVar25 + uVar27 * 4),auVar53,auVar93
                                     );
        auVar54 = vfmadd213ps_avx512f(auVar54,*(undefined1 (*) [64])(*pauVar4 + uVar27 * 4),
                                      *(undefined1 (*) [64])(*pauVar5 + uVar27 * 4));
        *(undefined1 (*) [64])(*pauVar25 + uVar27 * 4) = auVar54;
      }
      auVar137._4_4_ = uVar140;
      auVar137._0_4_ = uVar140;
      auVar137._8_4_ = uVar140;
      auVar137._12_4_ = uVar140;
      auVar50._4_4_ = auVar107._0_4_;
      auVar50._0_4_ = auVar107._0_4_;
      auVar50._8_4_ = auVar107._0_4_;
      auVar50._12_4_ = auVar107._0_4_;
      auVar50._16_4_ = auVar107._0_4_;
      auVar50._20_4_ = auVar107._0_4_;
      auVar50._24_4_ = auVar107._0_4_;
      auVar50._28_4_ = auVar107._0_4_;
      for (; (int)uVar27 + 8 <= iVar28; uVar27 = uVar27 + 8) {
        auVar44 = vfmadd132ps_fma(*(undefined1 (*) [32])(*pauVar25 + uVar27 * 4),auVar50,
                                  auVar93._0_32_);
        auVar44 = vfmadd213ps_fma(ZEXT1632(auVar44),*(undefined1 (*) [32])(*pauVar4 + uVar27 * 4),
                                  *(undefined1 (*) [32])(*pauVar5 + uVar27 * 4));
        *(undefined1 (*) [32])(*pauVar25 + uVar27 * 4) = ZEXT1632(auVar44);
      }
      auVar107._4_4_ = auVar107._0_4_;
      auVar107._8_4_ = auVar107._0_4_;
      auVar107._12_4_ = auVar107._0_4_;
      for (; (int)uVar27 + 4 <= iVar28; uVar27 = uVar27 + 4) {
        auVar44 = vfmadd132ps_fma(*(undefined1 (*) [16])(*pauVar25 + uVar27 * 4),auVar107,auVar137);
        auVar44 = vfmadd213ps_fma(auVar44,*(undefined1 (*) [16])(*pauVar4 + uVar27 * 4),
                                  *(undefined1 (*) [16])(*pauVar5 + uVar27 * 4));
        *(undefined1 (*) [16])(*pauVar25 + uVar27 * 4) = auVar44;
      }
      lVar31 = 0;
      for (uVar41 = uVar27 & 0xffffffff; (int)uVar41 < iVar28; uVar41 = (ulong)((int)uVar41 + 1)) {
        auVar44 = vfmadd132ss_fma(ZEXT416(*(uint *)(*pauVar25 + uVar27 * 4 + lVar31)),
                                  ZEXT416((uint)fVar121),auVar43);
        auVar44 = vfmadd213ss_fma(ZEXT416(*(uint *)(*pauVar4 + uVar27 * 4 + lVar31)),auVar44,
                                  ZEXT416(*(uint *)(*pauVar5 + uVar27 * 4 + lVar31)));
        *(int *)(*pauVar25 + uVar27 * 4 + lVar31) = auVar44._0_4_;
        lVar31 = lVar31 + 4;
      }
    }
  }
  else {
    uVar1 = bottom_top_blob->h;
    if (iVar35 == 3) {
      uVar41 = 0;
      uVar27 = (ulong)(uint)bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        uVar27 = uVar41;
      }
      if (*(int *)(&this->field_0xd0 + (long)p_Var3) == iVar28) {
        iVar35 = iVar28 * iVar32;
        fVar92 = 1.0 / (float)iVar28;
        auVar53 = vbroadcastss_avx512f(ZEXT416((uint)fVar92));
        uVar34 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar34 = uVar41;
        }
        auVar133._8_4_ = 0x80000000;
        auVar133._0_8_ = 0x8000000080000000;
        auVar133._12_4_ = 0x80000000;
        auVar142._8_4_ = 0xc0400000;
        auVar142._0_8_ = 0xc0400000c0400000;
        auVar142._12_4_ = 0xc0400000;
        auVar145._8_4_ = 0xc0400000;
        auVar145._0_8_ = 0xc0400000c0400000;
        auVar145._12_4_ = 0xc0400000;
        auVar145._16_4_ = 0xc0400000;
        auVar145._20_4_ = 0xc0400000;
        auVar145._24_4_ = 0xc0400000;
        auVar145._28_4_ = 0xc0400000;
        auVar54 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
        auVar55 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
        auVar56 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar74._12_4_ = 0;
        auVar74._0_12_ = ZEXT812(0);
        for (; uVar41 != uVar27; uVar41 = uVar41 + 1) {
          pp_Var2 = this->_vptr_LayerNorm_x86_avx512;
          for (uVar39 = 0; uVar39 != uVar34; uVar39 = uVar39 + 1) {
            pauVar42 = (undefined1 (*) [64])
                       ((long)bottom_top_blob->data +
                       (long)bottom_top_blob->w * uVar39 * bottom_top_blob->elemsize +
                       bottom_top_blob->cstep * uVar41 * bottom_top_blob->elemsize);
            auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
            pauVar25 = pauVar42;
            iVar28 = 0;
            while (iVar28 + 0x10 <= iVar35) {
              auVar146 = vaddps_avx512f(auVar146,*pauVar25);
              pauVar25 = pauVar25 + 1;
              iVar28 = iVar28 + 0x10;
            }
            auVar43 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
            auVar147 = ZEXT1664(auVar43);
            while( true ) {
              auVar48 = auVar147._0_32_;
              if (iVar35 < iVar28 + 8) break;
              auVar48 = vaddps_avx512vl(auVar48,*(undefined1 (*) [32])*pauVar25);
              auVar147 = ZEXT3264(auVar48);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
              iVar28 = iVar28 + 8;
            }
            auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
            while (iVar28 + 4 <= iVar35) {
              auVar43 = vaddps_avx512vl(auVar43,*(undefined1 (*) [16])*pauVar25);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
              iVar28 = iVar28 + 4;
            }
            auVar44 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
            for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
              auVar44 = vaddss_avx512f(auVar44,ZEXT416(*(uint *)*pauVar25));
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
            }
            if (iVar32 == 0x10) {
              auVar147 = vmulps_avx512f(auVar146,auVar53);
              auVar48 = vbroadcastss_avx512vl(auVar147._0_16_);
              bVar21 = true;
              bVar23 = false;
              bVar24 = false;
              auVar45 = auVar48._0_16_;
              bVar22 = false;
              auVar146 = auVar147;
              in_ZMM18 = auVar147;
            }
            else {
              auVar49 = vextractf64x4_avx512f(auVar146,1);
              if (iVar32 == 4) {
                auVar48 = vaddps_avx512vl(auVar146._0_32_,auVar48);
                auVar48 = vaddps_avx512vl(auVar48,auVar49);
                auVar43 = vaddps_avx512vl(auVar48._0_16_,auVar43);
                auVar100._0_4_ = auVar48._16_4_ + auVar43._0_4_;
                auVar100._4_4_ = auVar48._20_4_ + auVar43._4_4_;
                auVar100._8_4_ = auVar48._24_4_ + auVar43._8_4_;
                auVar100._12_4_ = auVar48._28_4_ + auVar43._12_4_;
                auVar45 = vmulps_avx512vl(auVar100,auVar53._0_16_);
                auVar146 = ZEXT1664(auVar45);
                auVar48 = vinsertf32x4_avx512vl(ZEXT1632(auVar45),auVar45,1);
                auVar147 = ZEXT3264(auVar48);
                bVar23 = true;
                bVar24 = false;
                in_ZMM18 = auVar146;
LAB_00497328:
                bVar22 = false;
              }
              else {
                if (iVar32 != 8) {
                  auVar47 = auVar147._0_16_;
                  if (iVar32 == 1) {
                    auVar146 = vaddps_avx512f(auVar146,ZEXT3264(auVar49));
                    auVar45 = vextractf32x4_avx512vl(auVar146._0_32_,1);
                    auVar45 = vaddps_avx512vl(auVar146._0_16_,auVar45);
                    auVar46 = vshufpd_avx512vl(auVar45,auVar45,1);
                    auVar45 = vaddps_avx512vl(auVar45,auVar46);
                    auVar45 = vhaddps_avx(auVar45,auVar45);
                    auVar45 = vaddss_avx512f(auVar44,auVar45);
                    auVar44 = vextractf32x4_avx512vl(auVar48,1);
                    auVar47 = vaddps_avx512vl(auVar44,auVar47);
                    auVar44 = vshufps_avx512vl(auVar43,auVar47,0x41);
                    auVar43 = vshufps_avx512vl(auVar43,auVar47,0xeb);
                    auVar43 = vaddps_avx512vl(auVar43,auVar44);
                    auVar47 = vshufpd_avx512vl(auVar43,auVar43,1);
                    auVar43 = vaddps_avx512vl(auVar43,auVar47);
                    auVar43 = vhaddps_avx(auVar43,auVar43);
                    auVar43 = vmulss_avx512f(ZEXT416((uint)(auVar45._0_4_ + auVar43._0_4_)),
                                             ZEXT416((uint)fVar92));
                    auVar72._32_32_ = auVar146._32_32_;
                    auVar72._0_32_ = vbroadcastss_avx512vl(auVar43);
                    auVar147 = ZEXT3264(auVar72._0_32_);
                    auVar74._16_48_ = auVar72._16_48_;
                    auVar73._4_60_ = auVar74._4_60_;
                    auVar73._0_4_ = auVar72._0_4_;
                    auVar146 = ZEXT1664(auVar73._0_16_);
                    bVar24 = true;
                    bVar23 = false;
                    auVar45 = auVar72._0_16_;
                    in_ZMM18 = ZEXT1664(auVar43);
                  }
                  else {
                    auVar45 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                    auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar43 = vxorps_avx512vl(auVar43,auVar43);
                    auVar47 = vxorps_avx512vl(auVar47,auVar47);
                    auVar147 = ZEXT1664(auVar47);
                    bVar23 = false;
                    bVar24 = false;
                    in_ZMM18 = ZEXT1664(auVar43);
                  }
                  goto LAB_00497328;
                }
                auVar48 = vaddps_avx512vl(auVar146._0_32_,auVar48);
                auVar48 = vaddps_avx512vl(auVar48,auVar49);
                auVar48 = vmulps_avx512vl(auVar48,auVar53._0_32_);
                auVar146 = ZEXT3264(auVar48);
                auVar45 = vbroadcastss_avx512vl(auVar48._0_16_);
                bVar22 = true;
                bVar23 = false;
                in_ZMM18 = ZEXT1664(auVar48._0_16_);
                bVar24 = false;
                auVar147 = auVar146;
              }
              auVar48 = auVar147._0_32_;
              auVar147 = vinsertf64x4_avx512f(auVar147,auVar48,1);
              bVar21 = false;
            }
            auVar75._16_48_ = auVar147._16_48_;
            auVar75._0_16_ = vxorps_avx512vl(auVar44,auVar44);
            pauVar25 = pauVar42;
            in_ZMM19 = ZEXT1664(auVar75._0_16_);
            iVar28 = 0;
            while (iVar28 + 0x10 <= iVar35) {
              auVar60 = vsubps_avx512f(*pauVar25,auVar147);
              auVar75 = vfmadd231ps_avx512f(in_ZMM19,auVar60,auVar60);
              pauVar25 = pauVar25 + 1;
              in_ZMM19 = auVar75;
              iVar28 = iVar28 + 0x10;
            }
            auVar76._16_48_ = auVar75._16_48_;
            auVar76._0_16_ = vxorps_avx512vl(auVar147._0_16_,auVar147._0_16_);
            auVar147 = ZEXT1664(auVar76._0_16_);
            while( true ) {
              auVar49 = auVar147._0_32_;
              if (iVar35 < iVar28 + 8) break;
              auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar25,auVar48);
              auVar76._0_32_ = vfmadd231ps_avx512vl(auVar49,auVar50,auVar50);
              auVar147 = ZEXT3264(auVar76._0_32_);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
              iVar28 = iVar28 + 8;
            }
            auVar43 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
            while (iVar28 + 4 <= iVar35) {
              auVar44 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar25,auVar45);
              auVar43 = vfmadd231ps_avx512vl(auVar43,auVar44,auVar44);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
              iVar28 = iVar28 + 4;
            }
            auVar44 = vxorps_avx512vl(auVar45,auVar45);
            while( true ) {
              in_ZMM21 = ZEXT1664(auVar44);
              if (iVar35 <= iVar28) break;
              auVar45 = vsubss_avx512f(ZEXT416(*(uint *)*pauVar25),in_ZMM18._0_16_);
              auVar44 = vfmadd231ss_avx512f(auVar44,auVar45,auVar45);
              iVar28 = iVar28 + 1;
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
            }
            if (bVar21) {
              in_ZMM16 = vmulps_avx512f(in_ZMM19,auVar53);
              auVar76._32_32_ = in_ZMM16._32_32_;
            }
            else {
              auVar45 = vxorps_avx512vl(auVar48._0_16_,auVar48._0_16_);
              in_ZMM16 = ZEXT1664(auVar45);
            }
            auVar77._0_32_ = vextractf64x4_avx512f(in_ZMM19,1);
            auVar77._32_32_ = auVar76._32_32_;
            auVar91 = auVar77._16_48_;
            if (bVar22) {
              auVar48 = vaddps_avx512vl(in_ZMM19._0_32_,auVar49);
              auVar49 = vaddps_avx512vl(auVar48,auVar77._0_32_);
              auVar48 = vmulps_avx512vl(auVar49,auVar53._0_32_);
              in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar48,0);
              auVar91 = in_ZMM16._16_48_;
            }
            if (bVar23) {
              auVar48 = vaddps_avx512vl(in_ZMM19._0_32_,auVar49);
              auVar49 = vaddps_avx512vl(auVar48,auVar77._0_32_);
              auVar45 = vextractf32x4_avx512vl(auVar49,1);
              auVar43 = vaddps_avx512vl(auVar49._0_16_,auVar43);
              auVar43 = vaddps_avx512vl(auVar43,auVar45);
              auVar45 = vmulps_avx512vl(auVar43,auVar53._0_16_);
              in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar45,0);
              auVar91 = in_ZMM16._16_48_;
            }
            auVar147 = ZEXT1664(auVar43);
            if (bVar24) {
              auVar60 = vaddps_avx512f(in_ZMM19,ZEXT3264(auVar77._0_32_));
              auVar79._16_48_ = auVar60._16_48_;
              auVar45 = vextractf32x4_avx512vl(auVar60._0_32_,1);
              auVar45 = vaddps_avx512vl(auVar60._0_16_,auVar45);
              auVar47 = vshufpd_avx512vl(auVar45,auVar45,1);
              auVar45 = vaddps_avx512vl(auVar45,auVar47);
              auVar45 = vhaddps_avx(auVar45,auVar45);
              auVar44 = vaddss_avx512f(auVar44,auVar45);
              auVar45 = vextractf32x4_avx512vl(auVar49,1);
              auVar45 = vaddps_avx512vl(auVar45,auVar49._0_16_);
              auVar47 = vshufps_avx512vl(auVar45,auVar43,0x11);
              auVar43 = vshufps_avx512vl(auVar45,auVar43,0xbb);
              auVar43 = vaddps_avx512vl(auVar43,auVar47);
              in_ZMM19 = ZEXT1664(auVar43);
              auVar45 = vshufpd_avx512vl(auVar43,auVar43,1);
              auVar43 = vaddps_avx512vl(auVar43,auVar45);
              auVar43 = vhaddps_avx(auVar43,auVar43);
              auVar79._0_16_ = in_ZMM16._0_16_;
              auVar78._4_60_ = auVar79._4_60_;
              auVar78._0_4_ = (auVar44._0_4_ + auVar43._0_4_) * fVar92;
              in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar78._0_16_,0);
              auVar91 = in_ZMM16._16_48_;
            }
            auVar44 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var2[-3]));
            auVar43 = in_ZMM16._0_16_;
            if (iVar32 == 1) {
              auVar45 = vaddss_avx512f(auVar43,auVar44);
              auVar44 = vrsqrtss_avx(auVar45,auVar45);
              auVar45 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar45._0_4_ * auVar44._0_4_)),auVar44,
                                            ZEXT416(0xc0400000));
              auVar44 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
              fVar121 = auVar44._0_4_ * auVar45._0_4_;
              auVar81._16_48_ = auVar91;
              auVar81._0_16_ = auVar43;
              auVar80._4_60_ = auVar81._4_60_;
              auVar80._0_4_ = fVar121;
              in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar80._0_16_,0);
              auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,auVar133);
              auVar103._4_12_ = auVar146._4_12_;
              auVar103._0_4_ = fVar121 * auVar43._0_4_;
              auVar146 = vinsertf32x4_avx512f(auVar146,auVar103,0);
            }
            else if (iVar32 == 4) {
              auVar44 = vbroadcastss_avx512vl(auVar44);
              auVar44 = vaddps_avx512vl(auVar43,auVar44);
              auVar43 = vrsqrtps_avx(auVar44);
              auVar101._0_4_ = auVar44._0_4_ * auVar43._0_4_;
              auVar101._4_4_ = auVar44._4_4_ * auVar43._4_4_;
              auVar101._8_4_ = auVar44._8_4_ * auVar43._8_4_;
              auVar101._12_4_ = auVar44._12_4_ * auVar43._12_4_;
              auVar44 = vfmadd213ps_fma(auVar101,auVar43,auVar142);
              auVar102._0_4_ = auVar43._0_4_ * -0.5 * auVar44._0_4_;
              auVar102._4_4_ = auVar43._4_4_ * -0.5 * auVar44._4_4_;
              auVar102._8_4_ = auVar43._8_4_ * -0.5 * auVar44._8_4_;
              auVar102._12_4_ = auVar43._12_4_ * -0.5 * auVar44._12_4_;
              auVar127._0_4_ = auVar102._0_4_ * -auVar146._0_4_;
              auVar127._4_4_ = auVar102._4_4_ * -auVar146._4_4_;
              auVar127._8_4_ = auVar102._8_4_ * -auVar146._8_4_;
              auVar127._12_4_ = auVar102._12_4_ * -auVar146._12_4_;
              in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar102,0);
              auVar146 = vinsertf32x4_avx512f(auVar146,auVar127,0);
            }
            else if (iVar32 == 8) {
              auVar48 = vbroadcastss_avx512vl(auVar44);
              auVar49 = vaddps_avx512vl(in_ZMM16._0_32_,auVar48);
              auVar48 = vrsqrtps_avx(auVar49);
              auVar18._4_4_ = auVar49._4_4_ * auVar48._4_4_;
              auVar18._0_4_ = auVar49._0_4_ * auVar48._0_4_;
              auVar18._8_4_ = auVar49._8_4_ * auVar48._8_4_;
              auVar18._12_4_ = auVar49._12_4_ * auVar48._12_4_;
              auVar18._16_4_ = auVar49._16_4_ * auVar48._16_4_;
              auVar18._20_4_ = auVar49._20_4_ * auVar48._20_4_;
              auVar18._24_4_ = auVar49._24_4_ * auVar48._24_4_;
              auVar18._28_4_ = auVar49._28_4_;
              auVar43 = vfmadd213ps_fma(auVar18,auVar48,auVar145);
              auVar116._0_4_ = auVar48._0_4_ * -0.5 * auVar43._0_4_;
              auVar116._4_4_ = auVar48._4_4_ * -0.5 * auVar43._4_4_;
              auVar116._8_4_ = auVar48._8_4_ * -0.5 * auVar43._8_4_;
              auVar116._12_4_ = auVar48._12_4_ * -0.5 * auVar43._12_4_;
              auVar116._16_4_ = auVar48._16_4_ * -0.5 * 0.0;
              auVar116._20_4_ = auVar48._20_4_ * -0.5 * 0.0;
              auVar116._24_4_ = auVar48._24_4_ * -0.5 * 0.0;
              auVar116._28_4_ = 0;
              auVar19._4_4_ = auVar116._4_4_ * -auVar146._4_4_;
              auVar19._0_4_ = auVar116._0_4_ * -auVar146._0_4_;
              auVar19._8_4_ = auVar116._8_4_ * -auVar146._8_4_;
              auVar19._12_4_ = auVar116._12_4_ * -auVar146._12_4_;
              auVar19._16_4_ = auVar116._16_4_ * -auVar146._16_4_;
              auVar19._20_4_ = auVar116._20_4_ * -auVar146._20_4_;
              auVar19._24_4_ = auVar116._24_4_ * -auVar146._24_4_;
              auVar19._28_4_ = auVar146._28_4_ ^ 0x80000000;
              in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar116,0);
              auVar146 = vinsertf64x4_avx512f(auVar146,auVar19,0);
            }
            else if (iVar32 == 0x10) {
              auVar60 = vbroadcastss_avx512f(auVar44);
              auVar60 = vaddps_avx512f(in_ZMM16,auVar60);
              auVar66 = vrsqrt14ps_avx512f(auVar60);
              auVar60 = vmulps_avx512f(auVar60,auVar66);
              auVar60 = vfmadd213ps_avx512f(auVar60,auVar66,auVar54);
              auVar66 = vmulps_avx512f(auVar66,auVar55);
              in_ZMM16 = vmulps_avx512f(auVar66,auVar60);
              auVar146 = vxorps_avx512dq(auVar146,auVar56);
              auVar146 = vmulps_avx512f(in_ZMM16,auVar146);
            }
            auVar44 = in_ZMM16._0_16_;
            auVar48 = in_ZMM16._0_32_;
            auVar43 = auVar146._0_16_;
            auVar49 = auVar146._0_32_;
            if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
              auVar45 = auVar43;
              auVar47 = auVar44;
              if (!bVar23) {
                auVar47 = vbroadcastss_avx512vl(auVar44);
                auVar45 = vbroadcastss_avx512vl(auVar43);
              }
              in_ZMM19 = ZEXT1664(auVar45);
              in_ZMM18 = ZEXT1664(auVar47);
              if (!bVar22) {
                auVar48 = vinsertf32x4_avx512vl(ZEXT1632(auVar47),auVar47,1);
                auVar49 = vinsertf32x4_avx512vl(ZEXT1632(auVar45),auVar45,1);
              }
              in_ZMM21 = ZEXT3264(auVar49);
              if (!bVar21) {
                in_ZMM16 = vinsertf64x4_avx512f(ZEXT3264(auVar48),auVar48,1);
                auVar146 = vinsertf64x4_avx512f(in_ZMM21,auVar49,1);
              }
              iVar28 = 0;
              while (iVar28 + 0x10 <= iVar35) {
                auVar147 = vfmadd132ps_avx512f(*pauVar42,auVar146,in_ZMM16);
                *pauVar42 = auVar147;
                pauVar42 = pauVar42 + 1;
                iVar28 = iVar28 + 0x10;
              }
              while (iVar28 + 8 <= iVar35) {
                auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar42,auVar49,auVar48);
                *(undefined1 (*) [32])*pauVar42 = auVar50;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
                iVar28 = iVar28 + 8;
              }
              while (iVar28 + 4 <= iVar35) {
                auVar46 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar42,auVar45,auVar47);
                *(undefined1 (*) [16])*pauVar42 = auVar46;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                iVar28 = iVar28 + 4;
              }
              for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
                auVar45 = vfmadd132ss_avx512f(ZEXT416(*(uint *)*pauVar42),auVar43,auVar44);
                *(int *)*pauVar42 = auVar45._0_4_;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
              }
            }
            else {
              pauVar25 = pauVar4;
              pauVar37 = pauVar5;
              if (bVar21) {
                for (iVar28 = 0x10; iVar28 <= iVar35; iVar28 = iVar28 + 0x10) {
                  auVar60 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar25));
                  auVar66 = vfmadd132ps_avx512f(*pauVar42,auVar146,in_ZMM16);
                  uVar140 = *(undefined4 *)*pauVar37;
                  auVar14._4_4_ = uVar140;
                  auVar14._0_4_ = uVar140;
                  auVar14._8_4_ = uVar140;
                  auVar14._12_4_ = uVar140;
                  auVar14._16_4_ = uVar140;
                  auVar14._20_4_ = uVar140;
                  auVar14._24_4_ = uVar140;
                  auVar14._28_4_ = uVar140;
                  auVar14._32_4_ = uVar140;
                  auVar14._36_4_ = uVar140;
                  auVar14._40_4_ = uVar140;
                  auVar14._44_4_ = uVar140;
                  auVar14._48_4_ = uVar140;
                  auVar14._52_4_ = uVar140;
                  auVar14._56_4_ = uVar140;
                  auVar14._60_4_ = uVar140;
                  auVar60 = vfmadd213ps_avx512f(auVar66,auVar60,auVar14);
                  *pauVar42 = auVar60;
                  pauVar42 = pauVar42 + 1;
                  pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                }
              }
              pauVar29 = pauVar42;
              if (bVar22) {
                auVar60 = vinsertf64x4_avx512f(in_ZMM16,auVar48,1);
                in_ZMM18 = vinsertf64x4_avx512f(auVar146,auVar49,1);
                lVar31 = 0;
                iVar36 = 8;
                iVar28 = 0;
                while (iVar28 = iVar28 + 0x10, iVar28 <= iVar35) {
                  auVar66 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar25 + lVar31)),auVar93,
                                              ZEXT464(*(uint *)(*pauVar25 + lVar31 + 4)));
                  in_ZMM19 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar37 + lVar31)),auVar93,
                                               ZEXT464(*(uint *)(*pauVar37 + lVar31 + 4)));
                  auVar69 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(*pauVar42 + lVar31 * 8),
                                                in_ZMM18,auVar60);
                  auVar66 = vfmadd213ps_avx512f(auVar69,auVar66,in_ZMM19);
                  *(undefined1 (*) [64])(*pauVar42 + lVar31 * 8) = auVar66;
                  pauVar29 = pauVar29 + 1;
                  lVar31 = lVar31 + 8;
                  iVar36 = iVar36 + 0x10;
                }
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
                pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
                for (; iVar36 <= iVar35; iVar36 = iVar36 + 8) {
                  uVar140 = *(undefined4 *)*pauVar25;
                  auVar117._4_4_ = uVar140;
                  auVar117._0_4_ = uVar140;
                  auVar117._8_4_ = uVar140;
                  auVar117._12_4_ = uVar140;
                  auVar117._16_4_ = uVar140;
                  auVar117._20_4_ = uVar140;
                  auVar117._24_4_ = uVar140;
                  auVar117._28_4_ = uVar140;
                  auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar29,auVar49,auVar48);
                  uVar140 = *(undefined4 *)*pauVar37;
                  auVar11._4_4_ = uVar140;
                  auVar11._0_4_ = uVar140;
                  auVar11._8_4_ = uVar140;
                  auVar11._12_4_ = uVar140;
                  auVar11._16_4_ = uVar140;
                  auVar11._20_4_ = uVar140;
                  auVar11._24_4_ = uVar140;
                  auVar11._28_4_ = uVar140;
                  auVar50 = vfmadd213ps_avx512vl(auVar50,auVar117,auVar11);
                  *(undefined1 (*) [32])*pauVar29 = auVar50;
                  pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
                  pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
                  pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
                }
              }
              if (bVar23) {
                auVar50 = vpermpd_avx512vl(auVar48,0x44);
                auVar51 = vpermpd_avx512vl(auVar49,0x44);
                in_ZMM18 = ZEXT3264(auVar51);
                auVar60 = vinsertf64x4_avx512f(in_ZMM16,auVar48,1);
                in_ZMM19 = vpermpd_avx512f(auVar60,0x44);
                auVar146 = vinsertf64x4_avx512f(auVar146,auVar49,1);
                auVar146 = vpermpd_avx512f(auVar146,0x44);
                pauVar42 = pauVar29;
                for (lVar31 = 0; (int)lVar31 + 0x10 <= iVar35; lVar31 = lVar31 + 0x10) {
                  auVar147 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 8)));
                  auVar60 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 0xc)));
                  auVar45 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                             ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
                  auVar48 = vpermpd_avx512vl(ZEXT1632(auVar45),0x50);
                  auVar147 = vinsertf64x4_avx512f(auVar147,auVar48,0);
                  auVar82._0_48_ = auVar147._0_48_;
                  auVar82._48_8_ = auVar60._48_8_;
                  auVar82._56_8_ = auVar60._56_8_;
                  auVar60 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 8)));
                  auVar66 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 0xc)));
                  auVar45 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                             ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
                  auVar48 = vpermpd_avx512vl(ZEXT1632(auVar45),0x50);
                  auVar147 = ZEXT3264(auVar48);
                  auVar60 = vinsertf64x4_avx512f(auVar60,auVar48,0);
                  auVar83._0_48_ = auVar60._0_48_;
                  auVar83._48_8_ = auVar66._48_8_;
                  auVar83._56_8_ = auVar66._56_8_;
                  auVar60 = vfmadd132ps_avx512f(*pauVar42,auVar146,in_ZMM19);
                  in_ZMM21 = vfmadd213ps_avx512f(auVar60,auVar82,auVar83);
                  *pauVar42 = in_ZMM21;
                  pauVar42 = pauVar42 + 1;
                }
                for (; (int)lVar31 + 8 <= iVar35; lVar31 = lVar31 + 8) {
                  auVar45 = vshufps_avx(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                        ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
                  auVar47 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                             ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
                  auVar48 = vpermpd_avx2(ZEXT1632(auVar45),0x50);
                  auVar49 = vpermpd_avx2(ZEXT1632(auVar47),0x50);
                  auVar88._32_32_ =
                       vfmadd132ps_avx512vl
                                 (*(undefined1 (*) [32])(*pauVar29 + lVar31 * 4),auVar51,auVar50);
                  auVar48 = vfmadd213ps_avx512vl(auVar88._32_32_,auVar48,auVar49);
                  in_ZMM19 = ZEXT3264(auVar48);
                  *(undefined1 (*) [32])(*pauVar29 + lVar31 * 4) = auVar48;
                  pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
                }
                for (; (int)lVar31 + 4 <= iVar35; lVar31 = lVar31 + 4) {
                  uVar140 = *(undefined4 *)(*pauVar25 + lVar31);
                  auVar104._4_4_ = uVar140;
                  auVar104._0_4_ = uVar140;
                  auVar104._8_4_ = uVar140;
                  auVar104._12_4_ = uVar140;
                  auVar45 = vfmadd132ps_avx512vl
                                      (*(undefined1 (*) [16])(*pauVar29 + lVar31 * 4),auVar43,
                                       auVar44);
                  uVar140 = *(undefined4 *)(*pauVar37 + lVar31);
                  auVar7._4_4_ = uVar140;
                  auVar7._0_4_ = uVar140;
                  auVar7._8_4_ = uVar140;
                  auVar7._12_4_ = uVar140;
                  auVar45 = vfmadd213ps_avx512vl(auVar45,auVar104,auVar7);
                  *(undefined1 (*) [16])(*pauVar29 + lVar31 * 4) = auVar45;
                  pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
                }
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
                pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
                pauVar29 = pauVar42;
              }
              auVar146 = auVar147;
              if (bVar24) {
                auVar147 = vbroadcastss_avx512f(auVar44);
                auVar60 = vbroadcastss_avx512f(auVar43);
                lVar31 = 0;
                pauVar42 = pauVar25;
                pauVar33 = pauVar37;
                pauVar40 = pauVar29;
                iVar28 = 0;
                while (iVar28 + 0x10 <= iVar35) {
                  auVar66 = vfmadd132ps_avx512f(*pauVar40,auVar60,auVar147);
                  auVar66 = vfmadd213ps_avx512f(auVar66,*pauVar42,*pauVar33);
                  *pauVar40 = auVar66;
                  pauVar40 = pauVar40 + 1;
                  pauVar42 = pauVar42 + 1;
                  pauVar33 = pauVar33 + 1;
                  lVar31 = lVar31 + 0x40;
                  iVar28 = iVar28 + 0x10;
                }
                auVar48 = vbroadcastss_avx512vl(auVar43);
                while (iVar28 + 8 <= iVar35) {
                  auVar49 = vfmadd132ps_avx512vl
                                      (*(undefined1 (*) [32])(*pauVar29 + lVar31),auVar48,
                                       auVar147._0_32_);
                  auVar45 = vfmadd213ps_fma(auVar49,*(undefined1 (*) [32])(*pauVar25 + lVar31),
                                            *(undefined1 (*) [32])(*pauVar37 + lVar31));
                  *(undefined1 (*) [32])(*pauVar29 + lVar31) = ZEXT1632(auVar45);
                  lVar31 = lVar31 + 0x20;
                  iVar28 = iVar28 + 8;
                }
                auVar45 = vbroadcastss_avx512vl(auVar43);
                in_ZMM18 = ZEXT1664(auVar45);
                while (iVar28 + 4 <= iVar35) {
                  auVar47 = vfmadd132ps_avx512vl
                                      (*(undefined1 (*) [16])(*pauVar29 + lVar31),auVar45,
                                       auVar147._0_16_);
                  auVar47 = vfmadd213ps_fma(auVar47,*(undefined1 (*) [16])(*pauVar25 + lVar31),
                                            *(undefined1 (*) [16])(*pauVar37 + lVar31));
                  *(undefined1 (*) [16])(*pauVar29 + lVar31) = auVar47;
                  lVar31 = lVar31 + 0x10;
                  iVar28 = iVar28 + 4;
                }
                puVar38 = (uint *)(*pauVar37 + lVar31);
                puVar26 = (uint *)(*pauVar25 + lVar31);
                puVar30 = (uint *)(*pauVar29 + lVar31);
                for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
                  auVar45 = vfmadd132ss_avx512f(ZEXT416(*puVar30),auVar43,auVar44);
                  auVar45 = vfmadd213ss_fma(ZEXT416(*puVar26),auVar45,ZEXT416(*puVar38));
                  *puVar30 = auVar45._0_4_;
                  puVar30 = puVar30 + 1;
                  puVar26 = puVar26 + 1;
                  puVar38 = puVar38 + 1;
                }
              }
            }
            in_ZMM22 = auVar146;
          }
        }
      }
      else {
        iVar35 = uVar1 * iVar28 * iVar32;
        fVar92 = 1.0 / (float)(int)(uVar1 * iVar28);
        auVar53 = vbroadcastss_avx512f(ZEXT416((uint)fVar92));
        uVar41 = 0;
        auVar138._8_4_ = 0x80000000;
        auVar138._0_8_ = 0x8000000080000000;
        auVar138._12_4_ = 0x80000000;
        auVar143._8_4_ = 0xc0400000;
        auVar143._0_8_ = 0xc0400000c0400000;
        auVar143._12_4_ = 0xc0400000;
        auVar51._8_4_ = 0xc0400000;
        auVar51._0_8_ = 0xc0400000c0400000;
        auVar51._12_4_ = 0xc0400000;
        auVar51._16_4_ = 0xc0400000;
        auVar51._20_4_ = 0xc0400000;
        auVar51._24_4_ = 0xc0400000;
        auVar51._28_4_ = 0xc0400000;
        auVar54 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
        auVar55 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
        auVar56 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar146._12_4_ = 0;
        auVar146._0_12_ = ZEXT812(0);
        for (; uVar41 != uVar27; uVar41 = uVar41 + 1) {
          pauVar42 = (undefined1 (*) [64])
                     (bottom_top_blob->cstep * uVar41 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          auVar147 = ZEXT1664(ZEXT816(0) << 0x40);
          pauVar25 = pauVar42;
          iVar28 = 0;
          while (iVar28 + 0x10 <= iVar35) {
            auVar147 = vaddps_avx512f(auVar147,*pauVar25);
            pauVar25 = pauVar25 + 1;
            iVar28 = iVar28 + 0x10;
          }
          auVar43 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
          auVar60 = ZEXT1664(auVar43);
          while( true ) {
            auVar48 = auVar60._0_32_;
            if (iVar35 < iVar28 + 8) break;
            auVar48 = vaddps_avx512vl(auVar48,*(undefined1 (*) [32])*pauVar25);
            auVar60 = ZEXT3264(auVar48);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
            iVar28 = iVar28 + 8;
          }
          auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
          while (iVar28 + 4 <= iVar35) {
            auVar43 = vaddps_avx512vl(auVar43,*(undefined1 (*) [16])*pauVar25);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
            iVar28 = iVar28 + 4;
          }
          auVar44 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
          for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
            auVar44 = vaddss_avx512f(auVar44,ZEXT416(*(uint *)*pauVar25));
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
          }
          if (iVar32 == 0x10) {
            auVar60 = vmulps_avx512f(auVar147,auVar53);
            auVar48 = vbroadcastss_avx512vl(auVar60._0_16_);
            bVar21 = true;
            bVar23 = false;
            bVar24 = false;
            auVar45 = auVar48._0_16_;
            bVar22 = false;
            auVar147 = auVar60;
            in_ZMM18 = auVar60;
          }
          else {
            auVar49 = vextractf64x4_avx512f(auVar147,1);
            if (iVar32 == 4) {
              auVar48 = vaddps_avx512vl(auVar147._0_32_,auVar48);
              auVar48 = vaddps_avx512vl(auVar48,auVar49);
              auVar43 = vaddps_avx512vl(auVar48._0_16_,auVar43);
              auVar108._0_4_ = auVar48._16_4_ + auVar43._0_4_;
              auVar108._4_4_ = auVar48._20_4_ + auVar43._4_4_;
              auVar108._8_4_ = auVar48._24_4_ + auVar43._8_4_;
              auVar108._12_4_ = auVar48._28_4_ + auVar43._12_4_;
              auVar45 = vmulps_avx512vl(auVar108,auVar53._0_16_);
              auVar147 = ZEXT1664(auVar45);
              auVar48 = vinsertf32x4_avx512vl(ZEXT1632(auVar45),auVar45,1);
              auVar60 = ZEXT3264(auVar48);
              bVar23 = true;
              bVar24 = false;
              in_ZMM18 = auVar147;
LAB_00497ff9:
              bVar22 = false;
            }
            else {
              if (iVar32 != 8) {
                auVar47 = auVar60._0_16_;
                if (iVar32 == 1) {
                  auVar147 = vaddps_avx512f(auVar147,ZEXT3264(auVar49));
                  auVar45 = vextractf32x4_avx512vl(auVar147._0_32_,1);
                  auVar45 = vaddps_avx512vl(auVar147._0_16_,auVar45);
                  auVar46 = vshufpd_avx512vl(auVar45,auVar45,1);
                  auVar45 = vaddps_avx512vl(auVar45,auVar46);
                  auVar45 = vhaddps_avx(auVar45,auVar45);
                  auVar45 = vaddss_avx512f(auVar44,auVar45);
                  auVar44 = vextractf32x4_avx512vl(auVar48,1);
                  auVar47 = vaddps_avx512vl(auVar44,auVar47);
                  auVar44 = vshufps_avx512vl(auVar43,auVar47,0x41);
                  auVar43 = vshufps_avx512vl(auVar43,auVar47,0xeb);
                  auVar43 = vaddps_avx512vl(auVar43,auVar44);
                  auVar47 = vshufpd_avx512vl(auVar43,auVar43,1);
                  auVar43 = vaddps_avx512vl(auVar43,auVar47);
                  auVar43 = vhaddps_avx(auVar43,auVar43);
                  auVar43 = vmulss_avx512f(ZEXT416((uint)(auVar45._0_4_ + auVar43._0_4_)),
                                           ZEXT416((uint)fVar92));
                  auVar66._32_32_ = auVar147._32_32_;
                  auVar66._0_32_ = vbroadcastss_avx512vl(auVar43);
                  auVar60 = ZEXT3264(auVar66._0_32_);
                  auVar146._16_48_ = auVar66._16_48_;
                  auVar147._4_60_ = auVar146._4_60_;
                  auVar147._0_4_ = auVar66._0_4_;
                  auVar147 = ZEXT1664(auVar147._0_16_);
                  bVar24 = true;
                  bVar23 = false;
                  auVar45 = auVar66._0_16_;
                  in_ZMM18 = ZEXT1664(auVar43);
                }
                else {
                  auVar45 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                  auVar147 = ZEXT1664(ZEXT816(0) << 0x40);
                  auVar43 = vxorps_avx512vl(auVar43,auVar43);
                  auVar47 = vxorps_avx512vl(auVar47,auVar47);
                  auVar60 = ZEXT1664(auVar47);
                  bVar23 = false;
                  bVar24 = false;
                  in_ZMM18 = ZEXT1664(auVar43);
                }
                goto LAB_00497ff9;
              }
              auVar48 = vaddps_avx512vl(auVar147._0_32_,auVar48);
              auVar48 = vaddps_avx512vl(auVar48,auVar49);
              auVar48 = vmulps_avx512vl(auVar48,auVar53._0_32_);
              auVar147 = ZEXT3264(auVar48);
              auVar45 = vbroadcastss_avx512vl(auVar48._0_16_);
              bVar22 = true;
              bVar23 = false;
              in_ZMM18 = ZEXT1664(auVar48._0_16_);
              bVar24 = false;
              auVar60 = auVar147;
            }
            auVar48 = auVar60._0_32_;
            auVar60 = vinsertf64x4_avx512f(auVar60,auVar48,1);
            bVar21 = false;
          }
          auVar69._16_48_ = auVar60._16_48_;
          auVar69._0_16_ = vxorps_avx512vl(auVar44,auVar44);
          pauVar25 = pauVar42;
          in_ZMM19 = ZEXT1664(auVar69._0_16_);
          iVar28 = 0;
          while (iVar28 + 0x10 <= iVar35) {
            auVar66 = vsubps_avx512f(*pauVar25,auVar60);
            auVar69 = vfmadd231ps_avx512f(in_ZMM19,auVar66,auVar66);
            pauVar25 = pauVar25 + 1;
            in_ZMM19 = auVar69;
            iVar28 = iVar28 + 0x10;
          }
          auVar88._16_48_ = auVar69._16_48_;
          auVar88._0_16_ = vxorps_avx512vl(auVar60._0_16_,auVar60._0_16_);
          auVar60 = ZEXT1664(auVar88._0_16_);
          while( true ) {
            auVar49 = auVar60._0_32_;
            if (iVar35 < iVar28 + 8) break;
            auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar25,auVar48);
            auVar88._0_32_ = vfmadd231ps_avx512vl(auVar49,auVar50,auVar50);
            auVar60 = ZEXT3264(auVar88._0_32_);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
            iVar28 = iVar28 + 8;
          }
          auVar43 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
          while (iVar28 + 4 <= iVar35) {
            auVar44 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar25,auVar45);
            auVar43 = vfmadd231ps_avx512vl(auVar43,auVar44,auVar44);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
            iVar28 = iVar28 + 4;
          }
          auVar44 = vxorps_avx512vl(auVar45,auVar45);
          while( true ) {
            in_ZMM21 = ZEXT1664(auVar44);
            if (iVar35 <= iVar28) break;
            auVar45 = vsubss_avx512f(ZEXT416(*(uint *)*pauVar25),in_ZMM18._0_16_);
            auVar44 = vfmadd231ss_avx512f(auVar44,auVar45,auVar45);
            iVar28 = iVar28 + 1;
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
          }
          if (bVar21) {
            in_ZMM16 = vmulps_avx512f(in_ZMM19,auVar53);
            auVar88._32_32_ = in_ZMM16._32_32_;
          }
          else {
            auVar45 = vxorps_avx512vl(auVar48._0_16_,auVar48._0_16_);
            in_ZMM16 = ZEXT1664(auVar45);
          }
          auVar60._0_32_ = vextractf64x4_avx512f(in_ZMM19,1);
          auVar60._32_32_ = auVar88._32_32_;
          auVar91 = auVar60._16_48_;
          if (bVar22) {
            auVar48 = vaddps_avx512vl(in_ZMM19._0_32_,auVar49);
            auVar49 = vaddps_avx512vl(auVar48,auVar60._0_32_);
            auVar48 = vmulps_avx512vl(auVar49,auVar53._0_32_);
            in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar48,0);
            auVar91 = in_ZMM16._16_48_;
          }
          if (bVar23) {
            auVar48 = vaddps_avx512vl(in_ZMM19._0_32_,auVar49);
            auVar49 = vaddps_avx512vl(auVar48,auVar60._0_32_);
            auVar45 = vextractf32x4_avx512vl(auVar49,1);
            auVar43 = vaddps_avx512vl(auVar49._0_16_,auVar43);
            auVar43 = vaddps_avx512vl(auVar43,auVar45);
            auVar45 = vmulps_avx512vl(auVar43,auVar53._0_16_);
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar45,0);
            auVar91 = in_ZMM16._16_48_;
          }
          auVar66 = ZEXT1664(auVar43);
          if (bVar24) {
            auVar60 = vaddps_avx512f(in_ZMM19,ZEXT3264(auVar60._0_32_));
            auVar85._16_48_ = auVar60._16_48_;
            auVar45 = vextractf32x4_avx512vl(auVar60._0_32_,1);
            auVar45 = vaddps_avx512vl(auVar60._0_16_,auVar45);
            auVar47 = vshufpd_avx512vl(auVar45,auVar45,1);
            auVar45 = vaddps_avx512vl(auVar45,auVar47);
            auVar45 = vhaddps_avx(auVar45,auVar45);
            auVar44 = vaddss_avx512f(auVar44,auVar45);
            auVar45 = vextractf32x4_avx512vl(auVar49,1);
            auVar45 = vaddps_avx512vl(auVar45,auVar49._0_16_);
            auVar47 = vshufps_avx512vl(auVar45,auVar43,0x11);
            auVar43 = vshufps_avx512vl(auVar45,auVar43,0xbb);
            auVar43 = vaddps_avx512vl(auVar43,auVar47);
            in_ZMM19 = ZEXT1664(auVar43);
            auVar45 = vshufpd_avx512vl(auVar43,auVar43,1);
            auVar43 = vaddps_avx512vl(auVar43,auVar45);
            auVar43 = vhaddps_avx(auVar43,auVar43);
            auVar85._0_16_ = in_ZMM16._0_16_;
            auVar84._4_60_ = auVar85._4_60_;
            auVar84._0_4_ = (auVar44._0_4_ + auVar43._0_4_) * fVar92;
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar84._0_16_,0);
            auVar91 = in_ZMM16._16_48_;
          }
          auVar44 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var2[-3]));
          auVar43 = in_ZMM16._0_16_;
          if (iVar32 == 1) {
            auVar45 = vaddss_avx512f(auVar43,auVar44);
            auVar44 = vrsqrtss_avx(auVar45,auVar45);
            auVar45 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar45._0_4_ * auVar44._0_4_)),auVar44,
                                          ZEXT416(0xc0400000));
            auVar44 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
            fVar121 = auVar44._0_4_ * auVar45._0_4_;
            auVar87._16_48_ = auVar91;
            auVar87._0_16_ = auVar43;
            auVar86._4_60_ = auVar87._4_60_;
            auVar86._0_4_ = fVar121;
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar86._0_16_,0);
            auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,auVar138);
            auVar111._4_12_ = auVar147._4_12_;
            auVar111._0_4_ = fVar121 * auVar43._0_4_;
            auVar147 = vinsertf32x4_avx512f(auVar147,auVar111,0);
          }
          else if (iVar32 == 4) {
            auVar44 = vbroadcastss_avx512vl(auVar44);
            auVar44 = vaddps_avx512vl(auVar43,auVar44);
            auVar43 = vrsqrtps_avx(auVar44);
            auVar109._0_4_ = auVar44._0_4_ * auVar43._0_4_;
            auVar109._4_4_ = auVar44._4_4_ * auVar43._4_4_;
            auVar109._8_4_ = auVar44._8_4_ * auVar43._8_4_;
            auVar109._12_4_ = auVar44._12_4_ * auVar43._12_4_;
            auVar44 = vfmadd213ps_fma(auVar109,auVar43,auVar143);
            auVar110._0_4_ = auVar43._0_4_ * -0.5 * auVar44._0_4_;
            auVar110._4_4_ = auVar43._4_4_ * -0.5 * auVar44._4_4_;
            auVar110._8_4_ = auVar43._8_4_ * -0.5 * auVar44._8_4_;
            auVar110._12_4_ = auVar43._12_4_ * -0.5 * auVar44._12_4_;
            auVar130._0_4_ = auVar110._0_4_ * -auVar147._0_4_;
            auVar130._4_4_ = auVar110._4_4_ * -auVar147._4_4_;
            auVar130._8_4_ = auVar110._8_4_ * -auVar147._8_4_;
            auVar130._12_4_ = auVar110._12_4_ * -auVar147._12_4_;
            in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar110,0);
            auVar147 = vinsertf32x4_avx512f(auVar147,auVar130,0);
          }
          else if (iVar32 == 8) {
            auVar48 = vbroadcastss_avx512vl(auVar44);
            auVar49 = vaddps_avx512vl(in_ZMM16._0_32_,auVar48);
            auVar48 = vrsqrtps_avx(auVar49);
            auVar52._4_4_ = auVar49._4_4_ * auVar48._4_4_;
            auVar52._0_4_ = auVar49._0_4_ * auVar48._0_4_;
            auVar52._8_4_ = auVar49._8_4_ * auVar48._8_4_;
            auVar52._12_4_ = auVar49._12_4_ * auVar48._12_4_;
            auVar52._16_4_ = auVar49._16_4_ * auVar48._16_4_;
            auVar52._20_4_ = auVar49._20_4_ * auVar48._20_4_;
            auVar52._24_4_ = auVar49._24_4_ * auVar48._24_4_;
            auVar52._28_4_ = auVar49._28_4_;
            auVar43 = vfmadd213ps_fma(auVar52,auVar48,auVar51);
            auVar118._0_4_ = auVar48._0_4_ * -0.5 * auVar43._0_4_;
            auVar118._4_4_ = auVar48._4_4_ * -0.5 * auVar43._4_4_;
            auVar118._8_4_ = auVar48._8_4_ * -0.5 * auVar43._8_4_;
            auVar118._12_4_ = auVar48._12_4_ * -0.5 * auVar43._12_4_;
            auVar118._16_4_ = auVar48._16_4_ * -0.5 * 0.0;
            auVar118._20_4_ = auVar48._20_4_ * -0.5 * 0.0;
            auVar118._24_4_ = auVar48._24_4_ * -0.5 * 0.0;
            auVar118._28_4_ = 0;
            auVar20._4_4_ = auVar118._4_4_ * -auVar147._4_4_;
            auVar20._0_4_ = auVar118._0_4_ * -auVar147._0_4_;
            auVar20._8_4_ = auVar118._8_4_ * -auVar147._8_4_;
            auVar20._12_4_ = auVar118._12_4_ * -auVar147._12_4_;
            auVar20._16_4_ = auVar118._16_4_ * -auVar147._16_4_;
            auVar20._20_4_ = auVar118._20_4_ * -auVar147._20_4_;
            auVar20._24_4_ = auVar118._24_4_ * -auVar147._24_4_;
            auVar20._28_4_ = auVar147._28_4_ ^ 0x80000000;
            in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar118,0);
            auVar147 = vinsertf64x4_avx512f(auVar147,auVar20,0);
          }
          else if (iVar32 == 0x10) {
            auVar60 = vbroadcastss_avx512f(auVar44);
            auVar60 = vaddps_avx512f(in_ZMM16,auVar60);
            auVar69 = vrsqrt14ps_avx512f(auVar60);
            auVar60 = vmulps_avx512f(auVar60,auVar69);
            auVar60 = vfmadd213ps_avx512f(auVar60,auVar69,auVar54);
            auVar69 = vmulps_avx512f(auVar69,auVar55);
            in_ZMM16 = vmulps_avx512f(auVar69,auVar60);
            auVar147 = vxorps_avx512dq(auVar147,auVar56);
            auVar147 = vmulps_avx512f(in_ZMM16,auVar147);
          }
          auVar44 = in_ZMM16._0_16_;
          auVar48 = in_ZMM16._0_32_;
          auVar43 = auVar147._0_16_;
          auVar49 = auVar147._0_32_;
          if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
            auVar45 = auVar43;
            auVar47 = auVar44;
            if (!bVar23) {
              auVar47 = vbroadcastss_avx512vl(auVar44);
              auVar45 = vbroadcastss_avx512vl(auVar43);
            }
            in_ZMM19 = ZEXT1664(auVar45);
            in_ZMM18 = ZEXT1664(auVar47);
            if (!bVar22) {
              auVar48 = vinsertf32x4_avx512vl(ZEXT1632(auVar47),auVar47,1);
              auVar49 = vinsertf32x4_avx512vl(ZEXT1632(auVar45),auVar45,1);
            }
            in_ZMM21 = ZEXT3264(auVar49);
            if (!bVar21) {
              in_ZMM16 = vinsertf64x4_avx512f(ZEXT3264(auVar48),auVar48,1);
              auVar147 = vinsertf64x4_avx512f(in_ZMM21,auVar49,1);
            }
            iVar28 = 0;
            while (iVar28 + 0x10 <= iVar35) {
              auVar60 = vfmadd132ps_avx512f(*pauVar42,auVar147,in_ZMM16);
              *pauVar42 = auVar60;
              pauVar42 = pauVar42 + 1;
              iVar28 = iVar28 + 0x10;
            }
            while (iVar28 + 8 <= iVar35) {
              auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar42,auVar49,auVar48);
              *(undefined1 (*) [32])*pauVar42 = auVar50;
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
              iVar28 = iVar28 + 8;
            }
            while (iVar28 + 4 <= iVar35) {
              auVar46 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar42,auVar45,auVar47);
              *(undefined1 (*) [16])*pauVar42 = auVar46;
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
              iVar28 = iVar28 + 4;
            }
            for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
              auVar45 = vfmadd132ss_avx512f(ZEXT416(*(uint *)*pauVar42),auVar43,auVar44);
              *(int *)*pauVar42 = auVar45._0_4_;
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
            }
          }
          else {
            pauVar25 = pauVar4;
            pauVar37 = pauVar5;
            if (bVar21) {
              for (iVar28 = 0x10; iVar28 <= iVar35; iVar28 = iVar28 + 0x10) {
                auVar60 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar25));
                auVar69 = vfmadd132ps_avx512f(*pauVar42,auVar147,in_ZMM16);
                uVar140 = *(undefined4 *)*pauVar37;
                auVar15._4_4_ = uVar140;
                auVar15._0_4_ = uVar140;
                auVar15._8_4_ = uVar140;
                auVar15._12_4_ = uVar140;
                auVar15._16_4_ = uVar140;
                auVar15._20_4_ = uVar140;
                auVar15._24_4_ = uVar140;
                auVar15._28_4_ = uVar140;
                auVar15._32_4_ = uVar140;
                auVar15._36_4_ = uVar140;
                auVar15._40_4_ = uVar140;
                auVar15._44_4_ = uVar140;
                auVar15._48_4_ = uVar140;
                auVar15._52_4_ = uVar140;
                auVar15._56_4_ = uVar140;
                auVar15._60_4_ = uVar140;
                auVar60 = vfmadd213ps_avx512f(auVar69,auVar60,auVar15);
                *pauVar42 = auVar60;
                pauVar42 = pauVar42 + 1;
                pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            pauVar29 = pauVar42;
            if (bVar22) {
              auVar60 = vinsertf64x4_avx512f(in_ZMM16,auVar48,1);
              in_ZMM18 = vinsertf64x4_avx512f(auVar147,auVar49,1);
              lVar31 = 0;
              iVar28 = 8;
              iVar36 = 0;
              while (iVar36 = iVar36 + 0x10, iVar36 <= iVar35) {
                auVar69 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar25 + lVar31)),auVar93,
                                            ZEXT464(*(uint *)(*pauVar25 + lVar31 + 4)));
                in_ZMM19 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar37 + lVar31)),auVar93,
                                             ZEXT464(*(uint *)(*pauVar37 + lVar31 + 4)));
                auVar88 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(*pauVar42 + lVar31 * 8),
                                              in_ZMM18,auVar60);
                auVar69 = vfmadd213ps_avx512f(auVar88,auVar69,in_ZMM19);
                *(undefined1 (*) [64])(*pauVar42 + lVar31 * 8) = auVar69;
                pauVar29 = pauVar29 + 1;
                lVar31 = lVar31 + 8;
                iVar28 = iVar28 + 0x10;
              }
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
              for (; iVar28 <= iVar35; iVar28 = iVar28 + 8) {
                uVar140 = *(undefined4 *)*pauVar25;
                auVar119._4_4_ = uVar140;
                auVar119._0_4_ = uVar140;
                auVar119._8_4_ = uVar140;
                auVar119._12_4_ = uVar140;
                auVar119._16_4_ = uVar140;
                auVar119._20_4_ = uVar140;
                auVar119._24_4_ = uVar140;
                auVar119._28_4_ = uVar140;
                auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar29,auVar49,auVar48);
                uVar140 = *(undefined4 *)*pauVar37;
                auVar12._4_4_ = uVar140;
                auVar12._0_4_ = uVar140;
                auVar12._8_4_ = uVar140;
                auVar12._12_4_ = uVar140;
                auVar12._16_4_ = uVar140;
                auVar12._20_4_ = uVar140;
                auVar12._24_4_ = uVar140;
                auVar12._28_4_ = uVar140;
                auVar50 = vfmadd213ps_avx512vl(auVar50,auVar119,auVar12);
                *(undefined1 (*) [32])*pauVar29 = auVar50;
                pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
                pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
                pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
              }
            }
            if (bVar23) {
              auVar50 = vpermpd_avx512vl(auVar48,0x44);
              auVar88._32_32_ = vpermpd_avx512vl(auVar49,0x44);
              in_ZMM18 = ZEXT3264(auVar88._32_32_);
              auVar60 = vinsertf64x4_avx512f(in_ZMM16,auVar48,1);
              in_ZMM19 = vpermpd_avx512f(auVar60,0x44);
              auVar147 = vinsertf64x4_avx512f(auVar147,auVar49,1);
              auVar147 = vpermpd_avx512f(auVar147,0x44);
              pauVar42 = pauVar29;
              for (lVar31 = 0; (int)lVar31 + 0x10 <= iVar35; lVar31 = lVar31 + 0x10) {
                auVar60 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 8)));
                auVar66 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 0xc)));
                auVar45 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                           ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
                auVar48 = vpermpd_avx512vl(ZEXT1632(auVar45),0x50);
                auVar60 = vinsertf64x4_avx512f(auVar60,auVar48,0);
                auVar89._0_48_ = auVar60._0_48_;
                auVar89._48_8_ = auVar66._48_8_;
                auVar89._56_8_ = auVar66._56_8_;
                auVar60 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 8)));
                auVar69 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 0xc)));
                auVar45 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                           ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
                auVar48 = vpermpd_avx512vl(ZEXT1632(auVar45),0x50);
                auVar66 = ZEXT3264(auVar48);
                auVar60 = vinsertf64x4_avx512f(auVar60,auVar48,0);
                auVar90._0_48_ = auVar60._0_48_;
                auVar90._48_8_ = auVar69._48_8_;
                auVar90._56_8_ = auVar69._56_8_;
                auVar60 = vfmadd132ps_avx512f(*pauVar42,auVar147,in_ZMM19);
                in_ZMM21 = vfmadd213ps_avx512f(auVar60,auVar89,auVar90);
                *pauVar42 = in_ZMM21;
                pauVar42 = pauVar42 + 1;
              }
              for (; (int)lVar31 + 8 <= iVar35; lVar31 = lVar31 + 8) {
                auVar45 = vshufps_avx(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                      ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
                auVar47 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                           ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
                auVar48 = vpermpd_avx2(ZEXT1632(auVar45),0x50);
                auVar49 = vpermpd_avx2(ZEXT1632(auVar47),0x50);
                auVar52 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])(*pauVar29 + lVar31 * 4),auVar88._32_32_,
                                     auVar50);
                auVar48 = vfmadd213ps_avx512vl(auVar52,auVar48,auVar49);
                in_ZMM19 = ZEXT3264(auVar48);
                *(undefined1 (*) [32])(*pauVar29 + lVar31 * 4) = auVar48;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
              }
              for (; (int)lVar31 + 4 <= iVar35; lVar31 = lVar31 + 4) {
                uVar140 = *(undefined4 *)(*pauVar25 + lVar31);
                auVar112._4_4_ = uVar140;
                auVar112._0_4_ = uVar140;
                auVar112._8_4_ = uVar140;
                auVar112._12_4_ = uVar140;
                auVar45 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])(*pauVar29 + lVar31 * 4),auVar43,auVar44)
                ;
                uVar140 = *(undefined4 *)(*pauVar37 + lVar31);
                auVar8._4_4_ = uVar140;
                auVar8._0_4_ = uVar140;
                auVar8._8_4_ = uVar140;
                auVar8._12_4_ = uVar140;
                auVar45 = vfmadd213ps_avx512vl(auVar45,auVar112,auVar8);
                *(undefined1 (*) [16])(*pauVar29 + lVar31 * 4) = auVar45;
                pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
              }
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
              pauVar29 = pauVar42;
            }
            auVar147 = auVar66;
            if (bVar24) {
              auVar60 = vbroadcastss_avx512f(auVar44);
              auVar66 = vbroadcastss_avx512f(auVar43);
              lVar31 = 0;
              pauVar42 = pauVar25;
              pauVar33 = pauVar37;
              pauVar40 = pauVar29;
              iVar28 = 0;
              while (iVar28 + 0x10 <= iVar35) {
                auVar69 = vfmadd132ps_avx512f(*pauVar40,auVar66,auVar60);
                auVar69 = vfmadd213ps_avx512f(auVar69,*pauVar42,*pauVar33);
                *pauVar40 = auVar69;
                pauVar40 = pauVar40 + 1;
                pauVar42 = pauVar42 + 1;
                pauVar33 = pauVar33 + 1;
                lVar31 = lVar31 + 0x40;
                iVar28 = iVar28 + 0x10;
              }
              auVar48 = vbroadcastss_avx512vl(auVar43);
              while (iVar28 + 8 <= iVar35) {
                auVar49 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [32])(*pauVar29 + lVar31),auVar48,
                                     auVar60._0_32_);
                auVar45 = vfmadd213ps_fma(auVar49,*(undefined1 (*) [32])(*pauVar25 + lVar31),
                                          *(undefined1 (*) [32])(*pauVar37 + lVar31));
                *(undefined1 (*) [32])(*pauVar29 + lVar31) = ZEXT1632(auVar45);
                lVar31 = lVar31 + 0x20;
                iVar28 = iVar28 + 8;
              }
              auVar45 = vbroadcastss_avx512vl(auVar43);
              in_ZMM18 = ZEXT1664(auVar45);
              while (iVar28 + 4 <= iVar35) {
                auVar47 = vfmadd132ps_avx512vl
                                    (*(undefined1 (*) [16])(*pauVar29 + lVar31),auVar45,
                                     auVar60._0_16_);
                auVar47 = vfmadd213ps_fma(auVar47,*(undefined1 (*) [16])(*pauVar25 + lVar31),
                                          *(undefined1 (*) [16])(*pauVar37 + lVar31));
                *(undefined1 (*) [16])(*pauVar29 + lVar31) = auVar47;
                lVar31 = lVar31 + 0x10;
                iVar28 = iVar28 + 4;
              }
              puVar38 = (uint *)(*pauVar37 + lVar31);
              puVar26 = (uint *)(*pauVar25 + lVar31);
              puVar30 = (uint *)(*pauVar29 + lVar31);
              for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
                auVar45 = vfmadd132ss_avx512f(ZEXT416(*puVar30),auVar43,auVar44);
                auVar45 = vfmadd213ss_fma(ZEXT416(*puVar26),auVar45,ZEXT416(*puVar38));
                *puVar30 = auVar45._0_4_;
                puVar30 = puVar30 + 1;
                puVar26 = puVar26 + 1;
                puVar38 = puVar38 + 1;
              }
            }
          }
          in_ZMM22 = auVar147;
        }
      }
    }
    else if (iVar35 == 2) {
      iVar35 = iVar28 * iVar32;
      fVar92 = 1.0 / (float)iVar28;
      uVar41 = 0;
      uVar27 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar27 = uVar41;
      }
      auVar53 = vbroadcastss_avx512f(ZEXT416((uint)fVar92));
      auVar126._8_4_ = 0x80000000;
      auVar126._0_8_ = 0x8000000080000000;
      auVar126._12_4_ = 0x80000000;
      auVar141._8_4_ = 0xc0400000;
      auVar141._0_8_ = 0xc0400000c0400000;
      auVar141._12_4_ = 0xc0400000;
      auVar144._8_4_ = 0xc0400000;
      auVar144._0_8_ = 0xc0400000c0400000;
      auVar144._12_4_ = 0xc0400000;
      auVar144._16_4_ = 0xc0400000;
      auVar144._20_4_ = 0xc0400000;
      auVar144._24_4_ = 0xc0400000;
      auVar144._28_4_ = 0xc0400000;
      auVar54 = vbroadcastss_avx512f(ZEXT416(0xc0400000));
      auVar55 = vbroadcastss_avx512f(ZEXT416(0xbf000000));
      auVar56 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar59._12_4_ = 0;
      auVar59._0_12_ = ZEXT812(0);
      for (; uVar41 != uVar27; uVar41 = uVar41 + 1) {
        pauVar42 = (undefined1 (*) [64])
                   ((long)bottom_top_blob->w * uVar41 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
        pauVar25 = pauVar42;
        iVar28 = 0;
        while (iVar28 + 0x10 <= iVar35) {
          auVar146 = vaddps_avx512f(auVar146,*pauVar25);
          pauVar25 = pauVar25 + 1;
          iVar28 = iVar28 + 0x10;
        }
        auVar43 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
        auVar147 = ZEXT1664(auVar43);
        while( true ) {
          auVar48 = auVar147._0_32_;
          if (iVar35 < iVar28 + 8) break;
          auVar48 = vaddps_avx512vl(auVar48,*(undefined1 (*) [32])*pauVar25);
          auVar147 = ZEXT3264(auVar48);
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
          iVar28 = iVar28 + 8;
        }
        auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,in_ZMM18._0_16_);
        while (iVar28 + 4 <= iVar35) {
          auVar43 = vaddps_avx512vl(auVar43,*(undefined1 (*) [16])*pauVar25);
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
          iVar28 = iVar28 + 4;
        }
        auVar44 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
        for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
          auVar44 = vaddss_avx512f(auVar44,ZEXT416(*(uint *)*pauVar25));
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
        }
        if (iVar32 == 0x10) {
          auVar147 = vmulps_avx512f(auVar146,auVar53);
          auVar48 = vbroadcastss_avx512vl(auVar147._0_16_);
          bVar21 = true;
          bVar23 = false;
          bVar24 = false;
          auVar45 = auVar48._0_16_;
          bVar22 = false;
          auVar146 = auVar147;
          in_ZMM18 = auVar147;
        }
        else {
          auVar49 = vextractf64x4_avx512f(auVar146,1);
          if (iVar32 == 4) {
            auVar48 = vaddps_avx512vl(auVar146._0_32_,auVar48);
            auVar48 = vaddps_avx512vl(auVar48,auVar49);
            auVar43 = vaddps_avx512vl(auVar48._0_16_,auVar43);
            auVar95._0_4_ = auVar48._16_4_ + auVar43._0_4_;
            auVar95._4_4_ = auVar48._20_4_ + auVar43._4_4_;
            auVar95._8_4_ = auVar48._24_4_ + auVar43._8_4_;
            auVar95._12_4_ = auVar48._28_4_ + auVar43._12_4_;
            auVar45 = vmulps_avx512vl(auVar95,auVar53._0_16_);
            auVar146 = ZEXT1664(auVar45);
            auVar48 = vinsertf32x4_avx512vl(ZEXT1632(auVar45),auVar45,1);
            auVar147 = ZEXT3264(auVar48);
            bVar23 = true;
            bVar24 = false;
            in_ZMM18 = auVar146;
LAB_00496918:
            bVar22 = false;
          }
          else {
            if (iVar32 != 8) {
              auVar47 = auVar147._0_16_;
              if (iVar32 == 1) {
                auVar146 = vaddps_avx512f(auVar146,ZEXT3264(auVar49));
                auVar45 = vextractf32x4_avx512vl(auVar146._0_32_,1);
                auVar45 = vaddps_avx512vl(auVar146._0_16_,auVar45);
                auVar46 = vshufpd_avx512vl(auVar45,auVar45,1);
                auVar45 = vaddps_avx512vl(auVar45,auVar46);
                auVar45 = vhaddps_avx(auVar45,auVar45);
                auVar45 = vaddss_avx512f(auVar44,auVar45);
                auVar44 = vextractf32x4_avx512vl(auVar48,1);
                auVar47 = vaddps_avx512vl(auVar44,auVar47);
                auVar44 = vshufps_avx512vl(auVar43,auVar47,0x41);
                auVar43 = vshufps_avx512vl(auVar43,auVar47,0xeb);
                auVar43 = vaddps_avx512vl(auVar43,auVar44);
                auVar47 = vshufpd_avx512vl(auVar43,auVar43,1);
                auVar43 = vaddps_avx512vl(auVar43,auVar47);
                auVar43 = vhaddps_avx(auVar43,auVar43);
                auVar43 = vmulss_avx512f(ZEXT416((uint)(auVar45._0_4_ + auVar43._0_4_)),
                                         ZEXT416((uint)fVar92));
                auVar57._32_32_ = auVar146._32_32_;
                auVar57._0_32_ = vbroadcastss_avx512vl(auVar43);
                auVar147 = ZEXT3264(auVar57._0_32_);
                auVar59._16_48_ = auVar57._16_48_;
                auVar58._4_60_ = auVar59._4_60_;
                auVar58._0_4_ = auVar57._0_4_;
                auVar146 = ZEXT1664(auVar58._0_16_);
                bVar24 = true;
                bVar23 = false;
                auVar45 = auVar57._0_16_;
                in_ZMM18 = ZEXT1664(auVar43);
              }
              else {
                auVar45 = vxorps_avx512vl(in_ZMM21._0_16_,in_ZMM21._0_16_);
                auVar146 = ZEXT1664(ZEXT816(0) << 0x40);
                auVar43 = vxorps_avx512vl(auVar43,auVar43);
                auVar47 = vxorps_avx512vl(auVar47,auVar47);
                auVar147 = ZEXT1664(auVar47);
                bVar23 = false;
                bVar24 = false;
                in_ZMM18 = ZEXT1664(auVar43);
              }
              goto LAB_00496918;
            }
            auVar48 = vaddps_avx512vl(auVar146._0_32_,auVar48);
            auVar48 = vaddps_avx512vl(auVar48,auVar49);
            auVar48 = vmulps_avx512vl(auVar48,auVar53._0_32_);
            auVar146 = ZEXT3264(auVar48);
            auVar45 = vbroadcastss_avx512vl(auVar48._0_16_);
            bVar22 = true;
            bVar23 = false;
            in_ZMM18 = ZEXT1664(auVar48._0_16_);
            bVar24 = false;
            auVar147 = auVar146;
          }
          auVar48 = auVar147._0_32_;
          auVar147 = vinsertf64x4_avx512f(auVar147,auVar48,1);
          bVar21 = false;
        }
        auVar61._16_48_ = auVar147._16_48_;
        auVar61._0_16_ = vxorps_avx512vl(auVar44,auVar44);
        pauVar25 = pauVar42;
        in_ZMM19 = ZEXT1664(auVar61._0_16_);
        iVar28 = 0;
        while (iVar28 + 0x10 <= iVar35) {
          auVar60 = vsubps_avx512f(*pauVar25,auVar147);
          auVar61 = vfmadd231ps_avx512f(in_ZMM19,auVar60,auVar60);
          pauVar25 = pauVar25 + 1;
          in_ZMM19 = auVar61;
          iVar28 = iVar28 + 0x10;
        }
        auVar62._16_48_ = auVar61._16_48_;
        auVar62._0_16_ = vxorps_avx512vl(auVar147._0_16_,auVar147._0_16_);
        auVar147 = ZEXT1664(auVar62._0_16_);
        while( true ) {
          auVar49 = auVar147._0_32_;
          if (iVar35 < iVar28 + 8) break;
          auVar50 = vsubps_avx512vl(*(undefined1 (*) [32])*pauVar25,auVar48);
          auVar62._0_32_ = vfmadd231ps_avx512vl(auVar49,auVar50,auVar50);
          auVar147 = ZEXT3264(auVar62._0_32_);
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x20);
          iVar28 = iVar28 + 8;
        }
        auVar43 = vxorps_avx512vl(in_ZMM22._0_16_,in_ZMM22._0_16_);
        while (iVar28 + 4 <= iVar35) {
          auVar44 = vsubps_avx512vl(*(undefined1 (*) [16])*pauVar25,auVar45);
          auVar43 = vfmadd231ps_avx512vl(auVar43,auVar44,auVar44);
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 0x10);
          iVar28 = iVar28 + 4;
        }
        auVar44 = vxorps_avx512vl(auVar45,auVar45);
        while( true ) {
          in_ZMM21 = ZEXT1664(auVar44);
          if (iVar35 <= iVar28) break;
          auVar45 = vsubss_avx512f(ZEXT416(*(uint *)*pauVar25),in_ZMM18._0_16_);
          auVar44 = vfmadd231ss_avx512f(auVar44,auVar45,auVar45);
          iVar28 = iVar28 + 1;
          pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
        }
        if (bVar21) {
          in_ZMM16 = vmulps_avx512f(in_ZMM19,auVar53);
          auVar62._32_32_ = in_ZMM16._32_32_;
        }
        else {
          auVar45 = vxorps_avx512vl(auVar48._0_16_,auVar48._0_16_);
          in_ZMM16 = ZEXT1664(auVar45);
        }
        auVar63._0_32_ = vextractf64x4_avx512f(in_ZMM19,1);
        auVar63._32_32_ = auVar62._32_32_;
        auVar91 = auVar63._16_48_;
        if (bVar22) {
          auVar48 = vaddps_avx512vl(in_ZMM19._0_32_,auVar49);
          auVar49 = vaddps_avx512vl(auVar48,auVar63._0_32_);
          auVar48 = vmulps_avx512vl(auVar49,auVar53._0_32_);
          in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar48,0);
          auVar91 = in_ZMM16._16_48_;
        }
        if (bVar23) {
          auVar48 = vaddps_avx512vl(in_ZMM19._0_32_,auVar49);
          auVar49 = vaddps_avx512vl(auVar48,auVar63._0_32_);
          auVar45 = vextractf32x4_avx512vl(auVar49,1);
          auVar43 = vaddps_avx512vl(auVar49._0_16_,auVar43);
          auVar43 = vaddps_avx512vl(auVar43,auVar45);
          auVar45 = vmulps_avx512vl(auVar43,auVar53._0_16_);
          in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar45,0);
          auVar91 = in_ZMM16._16_48_;
        }
        auVar147 = ZEXT1664(auVar43);
        if (bVar24) {
          auVar60 = vaddps_avx512f(in_ZMM19,ZEXT3264(auVar63._0_32_));
          auVar65._16_48_ = auVar60._16_48_;
          auVar45 = vextractf32x4_avx512vl(auVar60._0_32_,1);
          auVar45 = vaddps_avx512vl(auVar60._0_16_,auVar45);
          auVar47 = vshufpd_avx512vl(auVar45,auVar45,1);
          auVar45 = vaddps_avx512vl(auVar45,auVar47);
          auVar45 = vhaddps_avx(auVar45,auVar45);
          auVar44 = vaddss_avx512f(auVar44,auVar45);
          auVar45 = vextractf32x4_avx512vl(auVar49,1);
          auVar45 = vaddps_avx512vl(auVar45,auVar49._0_16_);
          auVar47 = vshufps_avx512vl(auVar45,auVar43,0x11);
          auVar43 = vshufps_avx512vl(auVar45,auVar43,0xbb);
          auVar43 = vaddps_avx512vl(auVar43,auVar47);
          in_ZMM19 = ZEXT1664(auVar43);
          auVar45 = vshufpd_avx512vl(auVar43,auVar43,1);
          auVar43 = vaddps_avx512vl(auVar43,auVar45);
          auVar43 = vhaddps_avx(auVar43,auVar43);
          auVar65._0_16_ = in_ZMM16._0_16_;
          auVar64._4_60_ = auVar65._4_60_;
          auVar64._0_4_ = (auVar44._0_4_ + auVar43._0_4_) * fVar92;
          in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar64._0_16_,0);
          auVar91 = in_ZMM16._16_48_;
        }
        auVar44 = ZEXT416(*(uint *)(&this->field_0xd4 + (long)pp_Var2[-3]));
        auVar43 = in_ZMM16._0_16_;
        if (iVar32 == 1) {
          auVar45 = vaddss_avx512f(auVar43,auVar44);
          auVar44 = vrsqrtss_avx(auVar45,auVar45);
          auVar45 = vfmadd213ss_avx512f(ZEXT416((uint)(auVar45._0_4_ * auVar44._0_4_)),auVar44,
                                        ZEXT416(0xc0400000));
          auVar44 = vmulss_avx512f(auVar44,ZEXT416(0xbf000000));
          fVar121 = auVar44._0_4_ * auVar45._0_4_;
          auVar68._16_48_ = auVar91;
          auVar68._0_16_ = auVar43;
          auVar67._4_60_ = auVar68._4_60_;
          auVar67._0_4_ = fVar121;
          in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar67._0_16_,0);
          auVar43 = vxorps_avx512vl(in_ZMM18._0_16_,auVar126);
          auVar98._4_12_ = auVar146._4_12_;
          auVar98._0_4_ = fVar121 * auVar43._0_4_;
          auVar146 = vinsertf32x4_avx512f(auVar146,auVar98,0);
        }
        else if (iVar32 == 4) {
          auVar44 = vbroadcastss_avx512vl(auVar44);
          auVar44 = vaddps_avx512vl(auVar43,auVar44);
          auVar43 = vrsqrtps_avx(auVar44);
          auVar96._0_4_ = auVar44._0_4_ * auVar43._0_4_;
          auVar96._4_4_ = auVar44._4_4_ * auVar43._4_4_;
          auVar96._8_4_ = auVar44._8_4_ * auVar43._8_4_;
          auVar96._12_4_ = auVar44._12_4_ * auVar43._12_4_;
          auVar44 = vfmadd213ps_fma(auVar96,auVar43,auVar141);
          auVar97._0_4_ = auVar43._0_4_ * -0.5 * auVar44._0_4_;
          auVar97._4_4_ = auVar43._4_4_ * -0.5 * auVar44._4_4_;
          auVar97._8_4_ = auVar43._8_4_ * -0.5 * auVar44._8_4_;
          auVar97._12_4_ = auVar43._12_4_ * -0.5 * auVar44._12_4_;
          auVar132._0_4_ = auVar97._0_4_ * -auVar146._0_4_;
          auVar132._4_4_ = auVar97._4_4_ * -auVar146._4_4_;
          auVar132._8_4_ = auVar97._8_4_ * -auVar146._8_4_;
          auVar132._12_4_ = auVar97._12_4_ * -auVar146._12_4_;
          in_ZMM16 = vinsertf32x4_avx512f(in_ZMM16,auVar97,0);
          auVar146 = vinsertf32x4_avx512f(auVar146,auVar132,0);
        }
        else if (iVar32 == 8) {
          auVar48 = vbroadcastss_avx512vl(auVar44);
          auVar49 = vaddps_avx512vl(in_ZMM16._0_32_,auVar48);
          auVar48 = vrsqrtps_avx(auVar49);
          auVar16._4_4_ = auVar49._4_4_ * auVar48._4_4_;
          auVar16._0_4_ = auVar49._0_4_ * auVar48._0_4_;
          auVar16._8_4_ = auVar49._8_4_ * auVar48._8_4_;
          auVar16._12_4_ = auVar49._12_4_ * auVar48._12_4_;
          auVar16._16_4_ = auVar49._16_4_ * auVar48._16_4_;
          auVar16._20_4_ = auVar49._20_4_ * auVar48._20_4_;
          auVar16._24_4_ = auVar49._24_4_ * auVar48._24_4_;
          auVar16._28_4_ = auVar49._28_4_;
          auVar43 = vfmadd213ps_fma(auVar16,auVar48,auVar144);
          auVar114._0_4_ = auVar48._0_4_ * -0.5 * auVar43._0_4_;
          auVar114._4_4_ = auVar48._4_4_ * -0.5 * auVar43._4_4_;
          auVar114._8_4_ = auVar48._8_4_ * -0.5 * auVar43._8_4_;
          auVar114._12_4_ = auVar48._12_4_ * -0.5 * auVar43._12_4_;
          auVar114._16_4_ = auVar48._16_4_ * -0.5 * 0.0;
          auVar114._20_4_ = auVar48._20_4_ * -0.5 * 0.0;
          auVar114._24_4_ = auVar48._24_4_ * -0.5 * 0.0;
          auVar114._28_4_ = 0;
          auVar17._4_4_ = auVar114._4_4_ * -auVar146._4_4_;
          auVar17._0_4_ = auVar114._0_4_ * -auVar146._0_4_;
          auVar17._8_4_ = auVar114._8_4_ * -auVar146._8_4_;
          auVar17._12_4_ = auVar114._12_4_ * -auVar146._12_4_;
          auVar17._16_4_ = auVar114._16_4_ * -auVar146._16_4_;
          auVar17._20_4_ = auVar114._20_4_ * -auVar146._20_4_;
          auVar17._24_4_ = auVar114._24_4_ * -auVar146._24_4_;
          auVar17._28_4_ = auVar146._28_4_ ^ 0x80000000;
          in_ZMM16 = vinsertf64x4_avx512f(in_ZMM16,auVar114,0);
          auVar146 = vinsertf64x4_avx512f(auVar146,auVar17,0);
        }
        else if (iVar32 == 0x10) {
          auVar60 = vbroadcastss_avx512f(auVar44);
          auVar60 = vaddps_avx512f(in_ZMM16,auVar60);
          auVar66 = vrsqrt14ps_avx512f(auVar60);
          auVar60 = vmulps_avx512f(auVar60,auVar66);
          auVar60 = vfmadd213ps_avx512f(auVar60,auVar66,auVar54);
          auVar66 = vmulps_avx512f(auVar66,auVar55);
          in_ZMM16 = vmulps_avx512f(auVar66,auVar60);
          auVar146 = vxorps_avx512dq(auVar146,auVar56);
          auVar146 = vmulps_avx512f(in_ZMM16,auVar146);
        }
        auVar44 = in_ZMM16._0_16_;
        auVar49 = in_ZMM16._0_32_;
        auVar43 = auVar146._0_16_;
        auVar48 = auVar146._0_32_;
        if (*(int *)(&this->field_0xd8 + (long)pp_Var2[-3]) == 0) {
          auVar45 = auVar43;
          auVar47 = auVar44;
          if (!bVar23) {
            auVar47 = vbroadcastss_avx512vl(auVar44);
            auVar45 = vbroadcastss_avx512vl(auVar43);
          }
          in_ZMM19 = ZEXT1664(auVar45);
          in_ZMM18 = ZEXT1664(auVar47);
          if (!bVar22) {
            auVar49 = vinsertf32x4_avx512vl(ZEXT1632(auVar47),auVar47,1);
            auVar48 = vinsertf32x4_avx512vl(ZEXT1632(auVar45),auVar45,1);
          }
          in_ZMM21 = ZEXT3264(auVar48);
          if (!bVar21) {
            in_ZMM16 = vinsertf64x4_avx512f(ZEXT3264(auVar49),auVar49,1);
            auVar146 = vinsertf64x4_avx512f(in_ZMM21,auVar48,1);
          }
          iVar28 = 0;
          while (iVar28 + 0x10 <= iVar35) {
            auVar147 = vfmadd132ps_avx512f(*pauVar42,auVar146,in_ZMM16);
            *pauVar42 = auVar147;
            pauVar42 = pauVar42 + 1;
            iVar28 = iVar28 + 0x10;
          }
          while (iVar28 + 8 <= iVar35) {
            auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar42,auVar48,auVar49);
            *(undefined1 (*) [32])*pauVar42 = auVar50;
            pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
            iVar28 = iVar28 + 8;
          }
          while (iVar28 + 4 <= iVar35) {
            auVar46 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])*pauVar42,auVar45,auVar47);
            *(undefined1 (*) [16])*pauVar42 = auVar46;
            pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
            iVar28 = iVar28 + 4;
          }
          for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
            auVar45 = vfmadd132ss_avx512f(ZEXT416(*(uint *)*pauVar42),auVar43,auVar44);
            *(int *)*pauVar42 = auVar45._0_4_;
            pauVar42 = (undefined1 (*) [64])(*pauVar42 + 4);
          }
        }
        else {
          pauVar25 = pauVar4;
          pauVar37 = pauVar5;
          if (bVar21) {
            for (iVar28 = 0x10; iVar28 <= iVar35; iVar28 = iVar28 + 0x10) {
              auVar60 = vbroadcastss_avx512f(ZEXT416(*(uint *)*pauVar25));
              auVar66 = vfmadd132ps_avx512f(*pauVar42,auVar146,in_ZMM16);
              uVar140 = *(undefined4 *)*pauVar37;
              auVar13._4_4_ = uVar140;
              auVar13._0_4_ = uVar140;
              auVar13._8_4_ = uVar140;
              auVar13._12_4_ = uVar140;
              auVar13._16_4_ = uVar140;
              auVar13._20_4_ = uVar140;
              auVar13._24_4_ = uVar140;
              auVar13._28_4_ = uVar140;
              auVar13._32_4_ = uVar140;
              auVar13._36_4_ = uVar140;
              auVar13._40_4_ = uVar140;
              auVar13._44_4_ = uVar140;
              auVar13._48_4_ = uVar140;
              auVar13._52_4_ = uVar140;
              auVar13._56_4_ = uVar140;
              auVar13._60_4_ = uVar140;
              auVar60 = vfmadd213ps_avx512f(auVar66,auVar60,auVar13);
              *pauVar42 = auVar60;
              pauVar42 = pauVar42 + 1;
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
            }
          }
          pauVar29 = pauVar42;
          if (bVar22) {
            auVar60 = vinsertf64x4_avx512f(in_ZMM16,auVar49,1);
            in_ZMM18 = vinsertf64x4_avx512f(auVar146,auVar48,1);
            lVar31 = 0;
            iVar28 = 8;
            iVar36 = 0;
            while (iVar36 = iVar36 + 0x10, iVar36 <= iVar35) {
              auVar66 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar25 + lVar31)),auVar93,
                                          ZEXT464(*(uint *)(*pauVar25 + lVar31 + 4)));
              in_ZMM19 = vpermt2ps_avx512f(ZEXT464(*(uint *)(*pauVar37 + lVar31)),auVar93,
                                           ZEXT464(*(uint *)(*pauVar37 + lVar31 + 4)));
              auVar69 = vfmadd132ps_avx512f(*(undefined1 (*) [64])(*pauVar42 + lVar31 * 8),in_ZMM18,
                                            auVar60);
              auVar66 = vfmadd213ps_avx512f(auVar69,auVar66,in_ZMM19);
              *(undefined1 (*) [64])(*pauVar42 + lVar31 * 8) = auVar66;
              pauVar29 = pauVar29 + 1;
              lVar31 = lVar31 + 8;
              iVar28 = iVar28 + 0x10;
            }
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
            for (; iVar28 <= iVar35; iVar28 = iVar28 + 8) {
              uVar140 = *(undefined4 *)*pauVar25;
              auVar115._4_4_ = uVar140;
              auVar115._0_4_ = uVar140;
              auVar115._8_4_ = uVar140;
              auVar115._12_4_ = uVar140;
              auVar115._16_4_ = uVar140;
              auVar115._20_4_ = uVar140;
              auVar115._24_4_ = uVar140;
              auVar115._28_4_ = uVar140;
              auVar50 = vfmadd132ps_avx512vl(*(undefined1 (*) [32])*pauVar29,auVar48,auVar49);
              uVar140 = *(undefined4 *)*pauVar37;
              auVar10._4_4_ = uVar140;
              auVar10._0_4_ = uVar140;
              auVar10._8_4_ = uVar140;
              auVar10._12_4_ = uVar140;
              auVar10._16_4_ = uVar140;
              auVar10._20_4_ = uVar140;
              auVar10._24_4_ = uVar140;
              auVar10._28_4_ = uVar140;
              auVar50 = vfmadd213ps_avx512vl(auVar50,auVar115,auVar10);
              *(undefined1 (*) [32])*pauVar29 = auVar50;
              pauVar29 = (undefined1 (*) [64])(*pauVar29 + 0x20);
              pauVar25 = (undefined1 (*) [64])(*pauVar25 + 4);
              pauVar37 = (undefined1 (*) [64])(*pauVar37 + 4);
            }
          }
          if (bVar23) {
            auVar50 = vpermpd_avx512vl(auVar49,0x44);
            auVar51 = vpermpd_avx512vl(auVar48,0x44);
            in_ZMM18 = ZEXT3264(auVar51);
            auVar60 = vinsertf64x4_avx512f(in_ZMM16,auVar49,1);
            in_ZMM19 = vpermpd_avx512f(auVar60,0x44);
            auVar146 = vinsertf64x4_avx512f(auVar146,auVar48,1);
            auVar146 = vpermpd_avx512f(auVar146,0x44);
            pauVar42 = pauVar29;
            for (lVar31 = 0; (int)lVar31 + 0x10 <= iVar35; lVar31 = lVar31 + 0x10) {
              auVar147 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 8)));
              auVar60 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar25 + lVar31 + 0xc)));
              auVar45 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                         ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
              auVar48 = vpermpd_avx512vl(ZEXT1632(auVar45),0x50);
              auVar147 = vinsertf64x4_avx512f(auVar147,auVar48,0);
              auVar70._0_48_ = auVar147._0_48_;
              auVar70._48_8_ = auVar60._48_8_;
              auVar70._56_8_ = auVar60._56_8_;
              auVar60 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 8)));
              auVar66 = vbroadcastss_avx512f(ZEXT416(*(uint *)(*pauVar37 + lVar31 + 0xc)));
              auVar45 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                         ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
              auVar48 = vpermpd_avx512vl(ZEXT1632(auVar45),0x50);
              auVar147 = ZEXT3264(auVar48);
              auVar60 = vinsertf64x4_avx512f(auVar60,auVar48,0);
              auVar71._0_48_ = auVar60._0_48_;
              auVar71._48_8_ = auVar66._48_8_;
              auVar71._56_8_ = auVar66._56_8_;
              auVar60 = vfmadd132ps_avx512f(*pauVar42,auVar146,in_ZMM19);
              in_ZMM21 = vfmadd213ps_avx512f(auVar60,auVar70,auVar71);
              *pauVar42 = in_ZMM21;
              pauVar42 = pauVar42 + 1;
            }
            for (; (int)lVar31 + 8 <= iVar35; lVar31 = lVar31 + 8) {
              auVar45 = vshufps_avx(ZEXT416(*(uint *)(*pauVar25 + lVar31)),
                                    ZEXT416(*(uint *)(*pauVar25 + lVar31 + 4)),0);
              auVar47 = vshufps_avx512vl(ZEXT416(*(uint *)(*pauVar37 + lVar31)),
                                         ZEXT416(*(uint *)(*pauVar37 + lVar31 + 4)),0);
              auVar48 = vpermpd_avx2(ZEXT1632(auVar45),0x50);
              auVar49 = vpermpd_avx2(ZEXT1632(auVar47),0x50);
              auVar88._32_32_ =
                   vfmadd132ps_avx512vl
                             (*(undefined1 (*) [32])(*pauVar29 + lVar31 * 4),auVar51,auVar50);
              auVar48 = vfmadd213ps_avx512vl(auVar88._32_32_,auVar48,auVar49);
              in_ZMM19 = ZEXT3264(auVar48);
              *(undefined1 (*) [32])(*pauVar29 + lVar31 * 4) = auVar48;
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x20);
            }
            for (; (int)lVar31 + 4 <= iVar35; lVar31 = lVar31 + 4) {
              uVar140 = *(undefined4 *)(*pauVar25 + lVar31);
              auVar99._4_4_ = uVar140;
              auVar99._0_4_ = uVar140;
              auVar99._8_4_ = uVar140;
              auVar99._12_4_ = uVar140;
              auVar45 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])(*pauVar29 + lVar31 * 4),auVar43,auVar44);
              uVar140 = *(undefined4 *)(*pauVar37 + lVar31);
              auVar6._4_4_ = uVar140;
              auVar6._0_4_ = uVar140;
              auVar6._8_4_ = uVar140;
              auVar6._12_4_ = uVar140;
              auVar45 = vfmadd213ps_avx512vl(auVar45,auVar99,auVar6);
              *(undefined1 (*) [16])(*pauVar29 + lVar31 * 4) = auVar45;
              pauVar42 = (undefined1 (*) [64])(*pauVar42 + 0x10);
            }
            pauVar37 = (undefined1 (*) [64])(*pauVar37 + lVar31);
            pauVar25 = (undefined1 (*) [64])(*pauVar25 + lVar31);
            pauVar29 = pauVar42;
          }
          auVar146 = auVar147;
          if (bVar24) {
            auVar147 = vbroadcastss_avx512f(auVar44);
            auVar60 = vbroadcastss_avx512f(auVar43);
            lVar31 = 0;
            pauVar42 = pauVar25;
            pauVar33 = pauVar37;
            pauVar40 = pauVar29;
            iVar28 = 0;
            while (iVar28 + 0x10 <= iVar35) {
              auVar66 = vfmadd132ps_avx512f(*pauVar40,auVar60,auVar147);
              auVar66 = vfmadd213ps_avx512f(auVar66,*pauVar42,*pauVar33);
              *pauVar40 = auVar66;
              pauVar40 = pauVar40 + 1;
              pauVar42 = pauVar42 + 1;
              pauVar33 = pauVar33 + 1;
              lVar31 = lVar31 + 0x40;
              iVar28 = iVar28 + 0x10;
            }
            auVar48 = vbroadcastss_avx512vl(auVar43);
            while (iVar28 + 8 <= iVar35) {
              auVar49 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(*pauVar29 + lVar31),auVar48,
                                   auVar147._0_32_);
              auVar45 = vfmadd213ps_fma(auVar49,*(undefined1 (*) [32])(*pauVar25 + lVar31),
                                        *(undefined1 (*) [32])(*pauVar37 + lVar31));
              *(undefined1 (*) [32])(*pauVar29 + lVar31) = ZEXT1632(auVar45);
              lVar31 = lVar31 + 0x20;
              iVar28 = iVar28 + 8;
            }
            auVar45 = vbroadcastss_avx512vl(auVar43);
            in_ZMM18 = ZEXT1664(auVar45);
            while (iVar28 + 4 <= iVar35) {
              auVar47 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [16])(*pauVar29 + lVar31),auVar45,
                                   auVar147._0_16_);
              auVar47 = vfmadd213ps_fma(auVar47,*(undefined1 (*) [16])(*pauVar25 + lVar31),
                                        *(undefined1 (*) [16])(*pauVar37 + lVar31));
              *(undefined1 (*) [16])(*pauVar29 + lVar31) = auVar47;
              lVar31 = lVar31 + 0x10;
              iVar28 = iVar28 + 4;
            }
            puVar38 = (uint *)(*pauVar37 + lVar31);
            puVar26 = (uint *)(*pauVar25 + lVar31);
            puVar30 = (uint *)(*pauVar29 + lVar31);
            for (; iVar28 < iVar35; iVar28 = iVar28 + 1) {
              auVar45 = vfmadd132ss_avx512f(ZEXT416(*puVar30),auVar43,auVar44);
              auVar45 = vfmadd213ss_fma(ZEXT416(*puVar26),auVar45,ZEXT416(*puVar38));
              *puVar30 = auVar45._0_4_;
              puVar30 = puVar30 + 1;
              puVar26 = puVar26 + 1;
              puVar38 = puVar38 + 1;
            }
          }
        }
        in_ZMM22 = auVar146;
      }
    }
  }
  return 0;
}

Assistant:

int LayerNorm_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int elempack = bottom_top_blob.elempack;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;

    const float* gamma = gamma_data;
    const float* beta = beta_data;

    if (dims == 1)
    {
        int elemcount = w * elempack;
        float* ptr = bottom_top_blob;
        // 1D layer norm is special. Treat them as unpacked.
        fast_1d_layer_norm(ptr, 1, elemcount, elemcount, gamma, beta, affine, eps);
    }

    if (dims == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);
            fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
        }
    }

    if (dims == 3)
    {
        if (affine_size == w)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                for (int i = 0; i < h; ++i)
                {
                    float* ptr = bottom_top_blob.channel(q).row(i);
                    fast_1d_layer_norm(ptr, elempack, w, w * elempack, gamma, beta, affine, eps);
                }
            }
        }
        else // if (affine_size == w * h)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; ++q)
            {
                float* ptr = bottom_top_blob.channel(q);
                fast_1d_layer_norm(ptr, elempack, w * h, w * h * elempack, gamma, beta, affine, eps);
            }
        }
    }

    return 0;
}